

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conelinei_intersector.h
# Opt level: O2

bool embree::avx::ConeCurveMiMBIntersectorK<8,_8,_true>::occluded
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *line)

{
  undefined8 *puVar1;
  undefined1 auVar2 [28];
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  Geometry *pGVar11;
  long lVar12;
  long lVar13;
  RTCFilterFunctionN p_Var14;
  ulong uVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  float fVar56;
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  byte bVar86;
  long lVar87;
  uint uVar88;
  Scene *pSVar89;
  undefined4 uVar90;
  long lVar91;
  ulong uVar92;
  bool bVar93;
  undefined1 auVar94 [16];
  undefined1 auVar96 [32];
  float fVar103;
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [16];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  float fVar120;
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  float fVar121;
  float fVar124;
  float fVar125;
  float fVar126;
  float fVar127;
  float fVar128;
  float fVar129;
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  float fVar130;
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  float fVar134;
  float fVar142;
  float fVar143;
  float fVar144;
  float fVar145;
  float fVar146;
  float fVar147;
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  float fVar153;
  float fVar158;
  float fVar159;
  float fVar160;
  float fVar161;
  float fVar162;
  float fVar163;
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [64];
  float fVar164;
  float fVar171;
  float fVar172;
  float fVar173;
  float fVar174;
  float fVar175;
  float fVar176;
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [64];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [64];
  float fVar184;
  float fVar185;
  float fVar186;
  float fVar187;
  float fVar188;
  float fVar189;
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [64];
  float fVar190;
  float fVar194;
  float fVar195;
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  float fVar196;
  float fVar201;
  float fVar202;
  float fVar203;
  float fVar204;
  float fVar205;
  float fVar206;
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  float fVar207;
  undefined1 auVar200 [32];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  undefined1 auVar214 [64];
  undefined1 auVar215 [32];
  undefined1 auVar216 [32];
  undefined1 auVar217 [64];
  RTCFilterFunctionNArguments args;
  RoundLineIntersectorHitM<8> hit;
  undefined1 local_6e0 [8];
  float fStack_6d8;
  float fStack_6d4;
  undefined8 uStack_6d0;
  undefined8 uStack_6c8;
  undefined1 local_6c0 [16];
  undefined1 local_6b0 [16];
  Scene *local_688;
  float local_680;
  float fStack_67c;
  float fStack_678;
  float fStack_674;
  float fStack_670;
  float fStack_66c;
  float fStack_668;
  float fStack_664;
  Primitive *local_660;
  size_t local_658;
  RTCFilterFunctionNArguments local_650;
  undefined1 local_620 [8];
  float fStack_618;
  float fStack_614;
  undefined8 uStack_610;
  undefined8 uStack_608;
  undefined1 local_600 [8];
  float fStack_5f8;
  float fStack_5f4;
  float fStack_5f0;
  float fStack_5ec;
  float fStack_5e8;
  float fStack_5e4;
  undefined1 local_5e0 [8];
  float fStack_5d8;
  float fStack_5d4;
  float fStack_5d0;
  float fStack_5cc;
  float fStack_5c8;
  undefined1 local_5c0 [8];
  float fStack_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  float fStack_5a8;
  float fStack_5a4;
  undefined1 local_5a0 [8];
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  float fStack_584;
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [8];
  float fStack_518;
  float fStack_514;
  undefined8 uStack_510;
  undefined8 uStack_508;
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  float local_460;
  float fStack_45c;
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  float fStack_444;
  float local_440;
  float fStack_43c;
  float fStack_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  undefined4 uStack_424;
  float local_420;
  float fStack_41c;
  float fStack_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  float fStack_404;
  float local_400;
  float fStack_3fc;
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  uint uStack_3e4;
  undefined1 local_3e0 [8];
  float fStack_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [16];
  undefined1 local_350 [16];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [8];
  float fStack_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float fStack_2e8;
  float fStack_2e4;
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [8];
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  undefined4 uStack_264;
  float local_260;
  float fStack_25c;
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  float fStack_244;
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined4 local_1e0;
  undefined4 uStack_1dc;
  undefined4 uStack_1d8;
  undefined4 uStack_1d4;
  undefined4 uStack_1d0;
  undefined4 uStack_1cc;
  undefined4 uStack_1c8;
  undefined4 uStack_1c4;
  undefined4 local_1c0;
  undefined4 uStack_1bc;
  undefined4 uStack_1b8;
  undefined4 uStack_1b4;
  undefined4 uStack_1b0;
  undefined4 uStack_1ac;
  undefined4 uStack_1a8;
  undefined4 uStack_1a4;
  uint local_1a0;
  uint uStack_19c;
  uint uStack_198;
  uint uStack_194;
  uint uStack_190;
  uint uStack_18c;
  uint uStack_188;
  uint uStack_184;
  undefined1 local_180 [16];
  undefined1 local_170 [16];
  uint local_160;
  uint uStack_15c;
  uint uStack_158;
  uint uStack_154;
  uint uStack_150;
  uint uStack_14c;
  uint uStack_148;
  uint uStack_144;
  uint local_140;
  uint uStack_13c;
  uint uStack_138;
  uint uStack_134;
  uint uStack_130;
  uint uStack_12c;
  uint uStack_128;
  uint uStack_124;
  undefined1 local_120 [32];
  float local_100;
  float fStack_fc;
  float fStack_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  float fStack_e4;
  float local_e0;
  float fStack_dc;
  float fStack_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  float fStack_c4;
  undefined1 local_c0 [32];
  float local_a0;
  float fStack_9c;
  float fStack_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  float fStack_84;
  float local_80;
  float fStack_7c;
  float fStack_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float fStack_68;
  undefined4 uStack_64;
  undefined1 auVar95 [32];
  undefined1 auVar210 [64];
  
  pSVar89 = context->scene;
  uVar88 = line->sharedGeomID;
  pGVar11 = (pSVar89->geometries).items[uVar88].ptr;
  fVar190 = (pGVar11->time_range).lower;
  fVar190 = pGVar11->fnumTimeSegments *
            ((*(float *)(ray + k * 4 + 0xe0) - fVar190) / ((pGVar11->time_range).upper - fVar190));
  auVar47 = vroundss_avx(ZEXT416((uint)fVar190),ZEXT416((uint)fVar190),9);
  auVar47 = vminss_avx(auVar47,ZEXT416((uint)(pGVar11->fnumTimeSegments + -1.0)));
  auVar47 = vmaxss_avx(ZEXT816(0),auVar47);
  uVar3 = (line->v0).field_0.i[0];
  lVar12 = *(long *)&pGVar11[3].time_range.upper;
  lVar87 = (long)(int)auVar47._0_4_ * 0x38;
  lVar13 = *(long *)(lVar12 + lVar87);
  lVar91 = *(long *)(lVar12 + 0x10 + lVar87);
  uVar4 = (line->v0).field_0.i[1];
  uVar5 = (line->v0).field_0.i[2];
  uVar6 = (line->v0).field_0.i[4];
  puVar1 = (undefined8 *)(lVar13 + lVar91 * (ulong)uVar6);
  uStack_610 = *puVar1;
  _local_620 = *(undefined1 (*) [16])(lVar13 + lVar91 * (ulong)uVar3);
  uStack_608 = puVar1[1];
  uVar7 = (line->v0).field_0.i[5];
  puVar1 = (undefined8 *)(lVar13 + lVar91 * (ulong)uVar7);
  uStack_6d0 = *puVar1;
  _local_6e0 = *(undefined1 (*) [16])(lVar13 + lVar91 * (ulong)uVar4);
  uStack_6c8 = puVar1[1];
  uVar8 = (line->v0).field_0.i[6];
  auVar131._16_16_ = *(undefined1 (*) [16])(lVar13 + lVar91 * (ulong)uVar8);
  auVar131._0_16_ = *(undefined1 (*) [16])(lVar13 + lVar91 * (ulong)uVar5);
  uVar9 = (line->v0).field_0.i[3];
  uVar10 = (line->v0).field_0.i[7];
  auVar122._16_16_ = *(undefined1 (*) [16])(lVar13 + lVar91 * (ulong)uVar10);
  auVar122._0_16_ = *(undefined1 (*) [16])(lVar13 + lVar91 * (ulong)uVar9);
  auVar104._16_16_ = *(undefined1 (*) [16])(lVar13 + lVar91 * (ulong)(uVar6 + 1));
  auVar104._0_16_ = *(undefined1 (*) [16])(lVar13 + lVar91 * (ulong)(uVar3 + 1));
  puVar1 = (undefined8 *)(lVar13 + lVar91 * (ulong)(uVar7 + 1));
  uStack_510 = *puVar1;
  _local_520 = *(undefined1 (*) [16])(lVar13 + lVar91 * (ulong)(uVar4 + 1));
  uStack_508 = puVar1[1];
  auVar148._16_16_ = *(undefined1 (*) [16])(lVar13 + lVar91 * (ulong)(uVar8 + 1));
  auVar148._0_16_ = *(undefined1 (*) [16])(lVar13 + lVar91 * (ulong)(uVar5 + 1));
  auVar177._16_16_ = *(undefined1 (*) [16])(lVar13 + lVar91 * (ulong)(uVar10 + 1));
  auVar177._0_16_ = *(undefined1 (*) [16])(lVar13 + lVar91 * (ulong)(uVar9 + 1));
  lVar13 = *(long *)(lVar12 + 0x38 + lVar87);
  lVar12 = *(long *)(lVar12 + 0x48 + lVar87);
  auVar180._16_16_ = *(undefined1 (*) [16])(lVar13 + (ulong)uVar6 * lVar12);
  auVar180._0_16_ = *(undefined1 (*) [16])(lVar13 + (ulong)uVar3 * lVar12);
  auVar191._16_16_ = *(undefined1 (*) [16])(lVar13 + (ulong)uVar7 * lVar12);
  auVar191._0_16_ = *(undefined1 (*) [16])(lVar13 + (ulong)uVar4 * lVar12);
  lVar91 = (ulong)uVar8 * lVar12;
  auVar197._16_16_ = *(undefined1 (*) [16])(lVar13 + lVar91);
  auVar197._0_16_ = *(undefined1 (*) [16])(lVar13 + (ulong)uVar5 * lVar12);
  auVar211._16_16_ = *(undefined1 (*) [16])(lVar13 + (ulong)uVar10 * lVar12);
  auVar211._0_16_ = *(undefined1 (*) [16])(lVar13 + (ulong)uVar9 * lVar12);
  auVar135._16_16_ = *(undefined1 (*) [16])(lVar13 + (ulong)(uVar6 + 1) * lVar12);
  auVar135._0_16_ = *(undefined1 (*) [16])(lVar13 + (ulong)(uVar3 + 1) * lVar12);
  auVar110._16_16_ = *(undefined1 (*) [16])(lVar13 + (ulong)(uVar8 + 1) * lVar12);
  auVar110._0_16_ = *(undefined1 (*) [16])(lVar13 + (ulong)(uVar5 + 1) * lVar12);
  fVar190 = fVar190 - auVar47._0_4_;
  auVar178 = vunpcklps_avx(_local_620,auVar131);
  auVar216 = vunpckhps_avx(_local_620,auVar131);
  auVar182 = vunpcklps_avx(_local_6e0,auVar122);
  auVar168 = vunpckhps_avx(_local_6e0,auVar122);
  auVar49 = vunpcklps_avx(auVar178,auVar182);
  auVar178 = vunpckhps_avx(auVar178,auVar182);
  auVar50 = vunpcklps_avx(auVar216,auVar168);
  auVar216 = vunpckhps_avx(auVar216,auVar168);
  auVar209 = vunpcklps_avx(auVar104,auVar148);
  auVar168 = vunpckhps_avx(auVar104,auVar148);
  auVar213 = vunpcklps_avx(_local_520,auVar177);
  auVar182 = vunpckhps_avx(_local_520,auVar177);
  auVar51 = vunpcklps_avx(auVar209,auVar213);
  auVar209 = vunpckhps_avx(auVar209,auVar213);
  auVar52 = vunpcklps_avx(auVar168,auVar182);
  auVar168 = vunpckhps_avx(auVar168,auVar182);
  auVar53 = vunpcklps_avx(auVar180,auVar197);
  auVar182 = vunpckhps_avx(auVar180,auVar197);
  auVar54 = vunpcklps_avx(auVar191,auVar211);
  auVar213 = vunpckhps_avx(auVar191,auVar211);
  auVar95 = vunpcklps_avx(auVar53,auVar54);
  auVar53 = vunpckhps_avx(auVar53,auVar54);
  auVar96 = vunpcklps_avx(auVar182,auVar213);
  auVar182 = vunpckhps_avx(auVar182,auVar213);
  auVar55 = vunpcklps_avx(auVar135,auVar110);
  auVar213 = vunpckhps_avx(auVar135,auVar110);
  auVar136._16_16_ = *(undefined1 (*) [16])(lVar13 + (ulong)(uVar7 + 1) * lVar12);
  auVar136._0_16_ = *(undefined1 (*) [16])(lVar13 + (ulong)(uVar4 + 1) * lVar12);
  auVar198._16_16_ = *(undefined1 (*) [16])(lVar13 + lVar12 * (ulong)(uVar10 + 1));
  auVar198._0_16_ = *(undefined1 (*) [16])(lVar13 + (ulong)(uVar9 + 1) * lVar12);
  auVar97 = vunpcklps_avx(auVar136,auVar198);
  auVar54 = vunpckhps_avx(auVar136,auVar198);
  auVar98 = vunpcklps_avx(auVar55,auVar97);
  auVar55 = vunpckhps_avx(auVar55,auVar97);
  auVar97 = vunpcklps_avx(auVar213,auVar54);
  auVar213 = vunpckhps_avx(auVar213,auVar54);
  auVar47 = vshufps_avx(ZEXT416((uint)fVar190),ZEXT416((uint)fVar190),0);
  auVar48 = vshufps_avx(ZEXT416((uint)(1.0 - fVar190)),ZEXT416((uint)(1.0 - fVar190)),0);
  fVar190 = auVar47._0_4_;
  fVar195 = auVar47._4_4_;
  fVar121 = auVar47._8_4_;
  fVar125 = auVar47._12_4_;
  fVar127 = auVar95._28_4_;
  fVar194 = auVar48._0_4_;
  fVar103 = auVar48._4_4_;
  fVar124 = auVar48._8_4_;
  fVar126 = auVar48._12_4_;
  local_5c0._0_4_ = auVar49._0_4_ * fVar194 + auVar95._0_4_ * fVar190;
  local_5c0._4_4_ = auVar49._4_4_ * fVar103 + auVar95._4_4_ * fVar195;
  fStack_5b8 = auVar49._8_4_ * fVar124 + auVar95._8_4_ * fVar121;
  fStack_5b4 = auVar49._12_4_ * fVar126 + auVar95._12_4_ * fVar125;
  fStack_5b0 = auVar49._16_4_ * fVar194 + auVar95._16_4_ * fVar190;
  fStack_5ac = auVar49._20_4_ * fVar103 + auVar95._20_4_ * fVar195;
  fStack_5a8 = auVar49._24_4_ * fVar124 + auVar95._24_4_ * fVar121;
  fStack_5a4 = auVar49._28_4_ + fVar127;
  auVar149._0_4_ = auVar178._0_4_ * fVar194 + fVar190 * auVar53._0_4_;
  auVar149._4_4_ = auVar178._4_4_ * fVar103 + fVar195 * auVar53._4_4_;
  auVar149._8_4_ = auVar178._8_4_ * fVar124 + fVar121 * auVar53._8_4_;
  auVar149._12_4_ = auVar178._12_4_ * fVar126 + fVar125 * auVar53._12_4_;
  auVar149._16_4_ = auVar178._16_4_ * fVar194 + fVar190 * auVar53._16_4_;
  auVar149._20_4_ = auVar178._20_4_ * fVar103 + fVar195 * auVar53._20_4_;
  auVar149._24_4_ = auVar178._24_4_ * fVar124 + fVar121 * auVar53._24_4_;
  auVar149._28_4_ = fVar127 + auVar53._28_4_;
  local_6e0._0_4_ = auVar50._0_4_;
  local_6e0._4_4_ = auVar50._4_4_;
  fStack_6d8 = auVar50._8_4_;
  fStack_6d4 = auVar50._12_4_;
  uStack_6d0._0_4_ = auVar50._16_4_;
  uStack_6d0._4_4_ = auVar50._20_4_;
  uStack_6c8._0_4_ = auVar50._24_4_;
  auVar192._0_4_ = fVar194 * (float)local_6e0._0_4_ + auVar96._0_4_ * fVar190;
  auVar192._4_4_ = fVar103 * (float)local_6e0._4_4_ + auVar96._4_4_ * fVar195;
  auVar192._8_4_ = fVar124 * fStack_6d8 + auVar96._8_4_ * fVar121;
  auVar192._12_4_ = fVar126 * fStack_6d4 + auVar96._12_4_ * fVar125;
  auVar192._16_4_ = fVar194 * (float)uStack_6d0 + auVar96._16_4_ * fVar190;
  auVar192._20_4_ = fVar103 * uStack_6d0._4_4_ + auVar96._20_4_ * fVar195;
  auVar192._24_4_ = fVar124 * (float)uStack_6c8 + auVar96._24_4_ * fVar121;
  auVar192._28_4_ = fVar127 + auVar96._28_4_;
  auVar181._8_4_ = 0x3f800000;
  auVar181._0_8_ = 0x3f8000003f800000;
  auVar181._12_4_ = 0x3f800000;
  auVar181._16_4_ = 0x3f800000;
  auVar181._20_4_ = 0x3f800000;
  auVar181._24_4_ = 0x3f800000;
  auVar181._28_4_ = 0x3f800000;
  local_6e0._0_4_ = fVar194 * auVar216._0_4_ + fVar190 * auVar182._0_4_;
  local_6e0._4_4_ = fVar103 * auVar216._4_4_ + fVar195 * auVar182._4_4_;
  fStack_6d8 = fVar124 * auVar216._8_4_ + fVar121 * auVar182._8_4_;
  fStack_6d4 = fVar126 * auVar216._12_4_ + fVar125 * auVar182._12_4_;
  uStack_6d0._0_4_ = fVar194 * auVar216._16_4_ + fVar190 * auVar182._16_4_;
  uStack_6d0._4_4_ = fVar103 * auVar216._20_4_ + fVar195 * auVar182._20_4_;
  uStack_6c8._0_4_ = fVar124 * auVar216._24_4_ + fVar121 * auVar182._24_4_;
  uStack_6c8._4_4_ = auVar216._28_4_ + auVar182._28_4_;
  local_600._0_4_ = fVar194 * auVar51._0_4_ + auVar98._0_4_ * fVar190;
  local_600._4_4_ = fVar103 * auVar51._4_4_ + auVar98._4_4_ * fVar195;
  fStack_5f8 = fVar124 * auVar51._8_4_ + auVar98._8_4_ * fVar121;
  fStack_5f4 = fVar126 * auVar51._12_4_ + auVar98._12_4_ * fVar125;
  fStack_5f0 = fVar194 * auVar51._16_4_ + auVar98._16_4_ * fVar190;
  fStack_5ec = fVar103 * auVar51._20_4_ + auVar98._20_4_ * fVar195;
  fStack_5e8 = fVar124 * auVar51._24_4_ + auVar98._24_4_ * fVar121;
  fStack_5e4 = auVar51._28_4_ + uStack_6c8._4_4_;
  auVar215._0_4_ = auVar209._0_4_ * fVar194 + auVar55._0_4_ * fVar190;
  auVar215._4_4_ = auVar209._4_4_ * fVar103 + auVar55._4_4_ * fVar195;
  auVar215._8_4_ = auVar209._8_4_ * fVar124 + auVar55._8_4_ * fVar121;
  auVar215._12_4_ = auVar209._12_4_ * fVar126 + auVar55._12_4_ * fVar125;
  auVar215._16_4_ = auVar209._16_4_ * fVar194 + auVar55._16_4_ * fVar190;
  auVar215._20_4_ = auVar209._20_4_ * fVar103 + auVar55._20_4_ * fVar195;
  auVar215._24_4_ = auVar209._24_4_ * fVar124 + auVar55._24_4_ * fVar121;
  auVar215._28_4_ = uStack_6c8._4_4_ + auVar216._28_4_;
  local_620._0_4_ = auVar52._0_4_;
  local_620._4_4_ = auVar52._4_4_;
  fStack_618 = auVar52._8_4_;
  fStack_614 = auVar52._12_4_;
  uStack_610._0_4_ = auVar52._16_4_;
  uStack_610._4_4_ = auVar52._20_4_;
  uStack_608._0_4_ = auVar52._24_4_;
  auVar165._0_4_ = fVar194 * (float)local_620._0_4_ + fVar190 * auVar97._0_4_;
  auVar165._4_4_ = fVar103 * (float)local_620._4_4_ + fVar195 * auVar97._4_4_;
  auVar165._8_4_ = fVar124 * fStack_618 + fVar121 * auVar97._8_4_;
  auVar165._12_4_ = fVar126 * fStack_614 + fVar125 * auVar97._12_4_;
  auVar165._16_4_ = fVar194 * (float)uStack_610 + fVar190 * auVar97._16_4_;
  auVar165._20_4_ = fVar103 * uStack_610._4_4_ + fVar195 * auVar97._20_4_;
  auVar165._24_4_ = fVar124 * (float)uStack_608 + fVar121 * auVar97._24_4_;
  auVar165._28_4_ = uStack_6c8._4_4_ + auVar97._28_4_;
  local_5e0._0_4_ = auVar168._0_4_;
  local_5e0._4_4_ = auVar168._4_4_;
  fStack_5d8 = auVar168._8_4_;
  fStack_5d4 = auVar168._12_4_;
  fStack_5d0 = auVar168._16_4_;
  fStack_5cc = auVar168._20_4_;
  fStack_5c8 = auVar168._24_4_;
  auVar94._0_4_ = fVar194 * (float)local_5e0._0_4_ + fVar190 * auVar213._0_4_;
  auVar94._4_4_ = fVar103 * (float)local_5e0._4_4_ + fVar195 * auVar213._4_4_;
  auVar94._8_4_ = fVar124 * fStack_5d8 + fVar121 * auVar213._8_4_;
  auVar94._12_4_ = fVar126 * fStack_5d4 + fVar125 * auVar213._12_4_;
  auVar95._16_4_ = fVar194 * fStack_5d0 + fVar190 * auVar213._16_4_;
  auVar95._0_16_ = auVar94;
  auVar95._20_4_ = fVar103 * fStack_5cc + fVar195 * auVar213._20_4_;
  auVar95._24_4_ = fVar124 * fStack_5c8 + fVar121 * auVar213._24_4_;
  auVar95._28_4_ = auVar97._28_4_ + auVar213._28_4_;
  auVar47 = vpcmpeqd_avx(auVar94,auVar94);
  auVar48 = vpcmpeqd_avx(auVar47,*(undefined1 (*) [16])(line->primIDs).field_0.field_1.vl);
  auVar47 = vpcmpeqd_avx(auVar47,*(undefined1 (*) [16])((long)&(line->primIDs).field_0 + 0x10));
  local_350 = vshufps_avx(ZEXT416(uVar88),ZEXT416(uVar88),0);
  local_360 = local_350;
  fStack_458 = *(float *)(ray + k * 4 + 0x80);
  local_680 = *(float *)(ray + k * 4 + 0xa0);
  local_260 = *(float *)(ray + k * 4 + 0xc0);
  auVar109 = ZEXT416((uint)(fStack_458 * fStack_458 + local_680 * local_680 + local_260 * local_260)
                    );
  auVar109 = vshufps_avx(auVar109,auVar109,0);
  auVar111._16_16_ = auVar109;
  auVar111._0_16_ = auVar109;
  auVar216 = vrcpps_avx(auVar111);
  auVar96._16_16_ = auVar47;
  auVar96._0_16_ = auVar48;
  fVar121 = auVar216._0_4_;
  fVar124 = auVar216._4_4_;
  auVar168._4_4_ = fVar124 * auVar109._4_4_;
  auVar168._0_4_ = fVar121 * auVar109._0_4_;
  fVar125 = auVar216._8_4_;
  auVar168._8_4_ = fVar125 * auVar109._8_4_;
  fVar126 = auVar216._12_4_;
  auVar168._12_4_ = fVar126 * auVar109._12_4_;
  fVar127 = auVar216._16_4_;
  auVar168._16_4_ = fVar127 * auVar109._0_4_;
  fVar128 = auVar216._20_4_;
  auVar168._20_4_ = fVar128 * auVar109._4_4_;
  fVar129 = auVar216._24_4_;
  auVar168._24_4_ = fVar129 * auVar109._8_4_;
  auVar168._28_4_ = auVar47._12_4_;
  auVar168 = vsubps_avx(auVar181,auVar168);
  fVar103 = auVar216._28_4_ + auVar168._28_4_;
  auVar182._4_4_ = ((float)local_5c0._4_4_ + (float)local_600._4_4_) * 0.5;
  auVar182._0_4_ = ((float)local_5c0._0_4_ + (float)local_600._0_4_) * 0.5;
  auVar182._8_4_ = (fStack_5b8 + fStack_5f8) * 0.5;
  auVar182._12_4_ = (fStack_5b4 + fStack_5f4) * 0.5;
  auVar182._16_4_ = (fStack_5b0 + fStack_5f0) * 0.5;
  auVar182._20_4_ = (fStack_5ac + fStack_5ec) * 0.5;
  auVar182._24_4_ = (fStack_5a8 + fStack_5e8) * 0.5;
  auVar182._28_4_ = fStack_5a4 + fStack_5e4;
  auVar216._4_4_ = (auVar215._4_4_ + auVar149._4_4_) * 0.5;
  auVar216._0_4_ = (auVar215._0_4_ + auVar149._0_4_) * 0.5;
  auVar216._8_4_ = (auVar215._8_4_ + auVar149._8_4_) * 0.5;
  auVar216._12_4_ = (auVar215._12_4_ + auVar149._12_4_) * 0.5;
  auVar216._16_4_ = (auVar215._16_4_ + auVar149._16_4_) * 0.5;
  auVar216._20_4_ = (auVar215._20_4_ + auVar149._20_4_) * 0.5;
  auVar216._24_4_ = (auVar215._24_4_ + auVar149._24_4_) * 0.5;
  auVar216._28_4_ = auVar215._28_4_ + auVar149._28_4_;
  auVar178._4_4_ = (auVar192._4_4_ + auVar165._4_4_) * 0.5;
  auVar178._0_4_ = (auVar192._0_4_ + auVar165._0_4_) * 0.5;
  auVar178._8_4_ = (auVar192._8_4_ + auVar165._8_4_) * 0.5;
  auVar178._12_4_ = (auVar192._12_4_ + auVar165._12_4_) * 0.5;
  auVar178._16_4_ = (auVar192._16_4_ + auVar165._16_4_) * 0.5;
  auVar178._20_4_ = (auVar192._20_4_ + auVar165._20_4_) * 0.5;
  auVar178._24_4_ = (auVar192._24_4_ + auVar165._24_4_) * 0.5;
  auVar178._28_4_ = 0x3f000000;
  fVar190 = *(float *)(ray + k * 4 + 0x20);
  auVar137._4_4_ = fVar190;
  auVar137._0_4_ = fVar190;
  auVar137._8_4_ = fVar190;
  auVar137._12_4_ = fVar190;
  auVar137._16_4_ = fVar190;
  auVar137._20_4_ = fVar190;
  auVar137._24_4_ = fVar190;
  auVar137._28_4_ = fVar190;
  auVar216 = vsubps_avx(auVar216,auVar137);
  fVar194 = *(float *)(ray + k * 4 + 0x40);
  auVar154._4_4_ = fVar194;
  auVar154._0_4_ = fVar194;
  auVar154._8_4_ = fVar194;
  auVar154._12_4_ = fVar194;
  auVar154._16_4_ = fVar194;
  auVar154._20_4_ = fVar194;
  auVar154._24_4_ = fVar194;
  auVar154._28_4_ = fVar194;
  auVar178 = vsubps_avx(auVar178,auVar154);
  fVar120 = auVar216._28_4_ + auVar178._28_4_;
  fVar195 = *(float *)(ray + k * 4);
  auVar123._4_4_ = fVar195;
  auVar123._0_4_ = fVar195;
  auVar123._8_4_ = fVar195;
  auVar123._12_4_ = fVar195;
  auVar123._16_4_ = fVar195;
  auVar123._20_4_ = fVar195;
  auVar123._24_4_ = fVar195;
  auVar123._28_4_ = fVar195;
  auVar182 = vsubps_avx(auVar182,auVar123);
  uStack_608._4_4_ = auVar182._28_4_ + fVar120;
  local_620._0_4_ =
       (fStack_458 * auVar182._0_4_ + local_680 * auVar216._0_4_ + local_260 * auVar178._0_4_) *
       (fVar121 + fVar121 * auVar168._0_4_);
  local_620._4_4_ =
       (fStack_458 * auVar182._4_4_ + local_680 * auVar216._4_4_ + local_260 * auVar178._4_4_) *
       (fVar124 + fVar124 * auVar168._4_4_);
  fStack_618 = (fStack_458 * auVar182._8_4_ +
               local_680 * auVar216._8_4_ + local_260 * auVar178._8_4_) *
               (fVar125 + fVar125 * auVar168._8_4_);
  fStack_614 = (fStack_458 * auVar182._12_4_ +
               local_680 * auVar216._12_4_ + local_260 * auVar178._12_4_) *
               (fVar126 + fVar126 * auVar168._12_4_);
  uStack_610._0_4_ =
       (fStack_458 * auVar182._16_4_ + local_680 * auVar216._16_4_ + local_260 * auVar178._16_4_) *
       (fVar127 + fVar127 * auVar168._16_4_);
  uStack_610._4_4_ =
       (fStack_458 * auVar182._20_4_ + local_680 * auVar216._20_4_ + local_260 * auVar178._20_4_) *
       (fVar128 + fVar128 * auVar168._20_4_);
  uStack_608._0_4_ =
       (fStack_458 * auVar182._24_4_ + local_680 * auVar216._24_4_ + local_260 * auVar178._24_4_) *
       (fVar129 + fVar129 * auVar168._24_4_);
  auVar199._0_4_ = fVar195 + fStack_458 * (float)local_620._0_4_;
  auVar199._4_4_ = fVar195 + fStack_458 * (float)local_620._4_4_;
  auVar199._8_4_ = fVar195 + fStack_458 * fStack_618;
  auVar199._12_4_ = fVar195 + fStack_458 * fStack_614;
  auVar199._16_4_ = fVar195 + fStack_458 * (float)uStack_610;
  auVar199._20_4_ = fVar195 + fStack_458 * uStack_610._4_4_;
  auVar199._24_4_ = fVar195 + fStack_458 * (float)uStack_608;
  auVar199._28_4_ = fVar195 + fVar103;
  auVar132._0_4_ = fVar190 + local_680 * (float)local_620._0_4_;
  auVar132._4_4_ = fVar190 + local_680 * (float)local_620._4_4_;
  auVar132._8_4_ = fVar190 + local_680 * fStack_618;
  auVar132._12_4_ = fVar190 + local_680 * fStack_614;
  auVar132._16_4_ = fVar190 + local_680 * (float)uStack_610;
  auVar132._20_4_ = fVar190 + local_680 * uStack_610._4_4_;
  auVar132._24_4_ = fVar190 + local_680 * (float)uStack_608;
  auVar132._28_4_ = fVar190 + fVar103;
  auVar97._0_4_ = fVar194 + local_260 * (float)local_620._0_4_;
  auVar97._4_4_ = fVar194 + local_260 * (float)local_620._4_4_;
  auVar97._8_4_ = fVar194 + local_260 * fStack_618;
  auVar97._12_4_ = fVar194 + local_260 * fStack_614;
  auVar97._16_4_ = fVar194 + local_260 * (float)uStack_610;
  auVar97._20_4_ = fVar194 + local_260 * uStack_610._4_4_;
  auVar97._24_4_ = fVar194 + local_260 * (float)uStack_608;
  auVar97._28_4_ = fVar194 + fVar103;
  local_3a0 = vsubps_avx(auVar215,auVar149);
  local_4c0 = vsubps_avx(auVar165,auVar192);
  fVar190 = local_4c0._0_4_;
  fVar125 = local_4c0._4_4_;
  fVar17 = local_4c0._8_4_;
  fVar23 = local_4c0._12_4_;
  fVar29 = local_4c0._16_4_;
  fVar35 = local_4c0._20_4_;
  fVar41 = local_4c0._24_4_;
  fVar194 = local_3a0._0_4_;
  fVar126 = local_3a0._4_4_;
  fVar18 = local_3a0._8_4_;
  fVar24 = local_3a0._12_4_;
  fVar30 = local_3a0._16_4_;
  fVar36 = local_3a0._20_4_;
  fVar42 = local_3a0._24_4_;
  fVar120 = fVar120 + uStack_608._4_4_;
  local_580 = vsubps_avx(_local_600,_local_5c0);
  fVar195 = local_580._0_4_;
  fVar127 = local_580._4_4_;
  fVar19 = local_580._8_4_;
  fVar25 = local_580._12_4_;
  fVar31 = local_580._16_4_;
  fVar37 = local_580._20_4_;
  fVar43 = local_580._24_4_;
  local_520._0_4_ = fVar195 * fVar195 + fVar194 * fVar194 + fVar190 * fVar190;
  local_520._4_4_ = fVar127 * fVar127 + fVar126 * fVar126 + fVar125 * fVar125;
  fStack_518 = fVar19 * fVar19 + fVar18 * fVar18 + fVar17 * fVar17;
  fStack_514 = fVar25 * fVar25 + fVar24 * fVar24 + fVar23 * fVar23;
  uStack_510._0_4_ = fVar31 * fVar31 + fVar30 * fVar30 + fVar29 * fVar29;
  uStack_510._4_4_ = fVar37 * fVar37 + fVar36 * fVar36 + fVar35 * fVar35;
  uStack_508._0_4_ = fVar43 * fVar43 + fVar42 * fVar42 + fVar41 * fVar41;
  uStack_508._4_4_ = fStack_5e4 + fVar120;
  local_4e0 = vsubps_avx(auVar132,auVar149);
  local_500 = vsubps_avx(auVar97,auVar192);
  fVar103 = local_500._0_4_;
  fVar128 = local_500._4_4_;
  fVar20 = local_500._8_4_;
  fVar26 = local_500._12_4_;
  fVar32 = local_500._16_4_;
  fVar38 = local_500._20_4_;
  fVar44 = local_500._24_4_;
  fVar121 = local_4e0._0_4_;
  fVar129 = local_4e0._4_4_;
  fVar21 = local_4e0._8_4_;
  fVar27 = local_4e0._12_4_;
  fVar33 = local_4e0._16_4_;
  fVar39 = local_4e0._20_4_;
  fVar45 = local_4e0._24_4_;
  fVar120 = fStack_5e4 + fVar120;
  _local_5c0 = vsubps_avx(auVar199,_local_5c0);
  fVar164 = local_5c0._0_4_;
  fVar171 = local_5c0._4_4_;
  fVar172 = local_5c0._8_4_;
  fVar173 = local_5c0._12_4_;
  fVar174 = local_5c0._16_4_;
  fVar175 = local_5c0._20_4_;
  fVar176 = local_5c0._24_4_;
  fVar196 = fVar164 * fVar195 + fVar194 * fVar121 + fVar190 * fVar103;
  fVar201 = fVar171 * fVar127 + fVar126 * fVar129 + fVar125 * fVar128;
  fVar202 = fVar172 * fVar19 + fVar18 * fVar21 + fVar17 * fVar20;
  fVar203 = fVar173 * fVar25 + fVar24 * fVar27 + fVar23 * fVar26;
  fVar204 = fVar174 * fVar31 + fVar30 * fVar33 + fVar29 * fVar32;
  fVar205 = fVar175 * fVar37 + fVar36 * fVar39 + fVar35 * fVar38;
  fVar206 = fVar176 * fVar43 + fVar42 * fVar45 + fVar41 * fVar44;
  fVar207 = fStack_5e4 + fVar120;
  fVar120 = fStack_5e4 + fVar120;
  auVar193._0_4_ = fStack_458 * fVar195 + fVar194 * local_680 + local_260 * fVar190;
  auVar193._4_4_ = fStack_458 * fVar127 + fVar126 * local_680 + local_260 * fVar125;
  auVar193._8_4_ = fStack_458 * fVar19 + fVar18 * local_680 + local_260 * fVar17;
  auVar193._12_4_ = fStack_458 * fVar25 + fVar24 * local_680 + local_260 * fVar23;
  auVar193._16_4_ = fStack_458 * fVar31 + fVar30 * local_680 + local_260 * fVar29;
  auVar193._20_4_ = fStack_458 * fVar37 + fVar36 * local_680 + local_260 * fVar35;
  auVar193._24_4_ = fStack_458 * fVar43 + fVar42 * local_680 + local_260 * fVar41;
  auVar193._28_4_ = fStack_5e4 + fVar120;
  fStack_25c = local_260;
  fStack_258 = local_260;
  fStack_254 = local_260;
  fStack_250 = local_260;
  fStack_24c = local_260;
  fStack_248 = local_260;
  fStack_244 = local_260;
  _local_460 = CONCAT44(fStack_458,fStack_458);
  fVar56 = local_4c0._28_4_;
  auVar216 = vsubps_avx(_local_6e0,auVar95);
  fVar124 = auVar216._0_4_;
  fVar16 = auVar216._4_4_;
  fVar22 = auVar216._8_4_;
  fVar28 = auVar216._12_4_;
  fVar34 = auVar216._16_4_;
  fVar40 = auVar216._20_4_;
  fVar46 = auVar216._24_4_;
  local_400 = (float)local_520._0_4_ + fVar124 * fVar124;
  fStack_3fc = (float)local_520._4_4_ + fVar16 * fVar16;
  fStack_3f8 = fStack_518 + fVar22 * fVar22;
  fStack_3f4 = fStack_514 + fVar28 * fVar28;
  fStack_3f0 = (float)uStack_510 + fVar34 * fVar34;
  fStack_3ec = uStack_510._4_4_ + fVar40 * fVar40;
  fStack_3e8 = (float)uStack_508 + fVar46 * fVar46;
  fVar134 = (float)local_520._0_4_ * (float)local_520._0_4_;
  fVar142 = (float)local_520._4_4_ * (float)local_520._4_4_;
  local_280._4_4_ = fVar142;
  local_280._0_4_ = fVar134;
  fVar143 = fStack_518 * fStack_518;
  fStack_278 = fVar143;
  fVar144 = fStack_514 * fStack_514;
  fStack_274 = fVar144;
  fVar145 = (float)uStack_510 * (float)uStack_510;
  fStack_270 = fVar145;
  fVar146 = uStack_510._4_4_ * uStack_510._4_4_;
  fStack_26c = fVar146;
  fVar147 = (float)uStack_508 * (float)uStack_508;
  fStack_268 = fVar147;
  uStack_264 = fVar56;
  auVar209._4_4_ = fVar142 * (fStack_458 * fVar171 + local_680 * fVar129 + local_260 * fVar128);
  auVar209._0_4_ = fVar134 * (fStack_458 * fVar164 + local_680 * fVar121 + local_260 * fVar103);
  auVar209._8_4_ = fVar143 * (fStack_458 * fVar172 + local_680 * fVar21 + local_260 * fVar20);
  auVar209._12_4_ = fVar144 * (fStack_458 * fVar173 + local_680 * fVar27 + local_260 * fVar26);
  auVar209._16_4_ = fVar145 * (fStack_458 * fVar174 + local_680 * fVar33 + local_260 * fVar32);
  auVar209._20_4_ = fVar146 * (fStack_458 * fVar175 + local_680 * fVar39 + local_260 * fVar38);
  auVar209._24_4_ = fVar147 * (fStack_458 * fVar176 + local_680 * fVar45 + local_260 * fVar44);
  auVar209._28_4_ = fStack_5e4 + fStack_5e4 + fVar120;
  fVar120 = local_500._28_4_;
  auVar213._4_4_ = fStack_3fc * auVar193._4_4_ * fVar201;
  auVar213._0_4_ = local_400 * auVar193._0_4_ * fVar196;
  auVar213._8_4_ = fStack_3f8 * auVar193._8_4_ * fVar202;
  auVar213._12_4_ = fStack_3f4 * auVar193._12_4_ * fVar203;
  auVar213._16_4_ = fStack_3f0 * auVar193._16_4_ * fVar204;
  auVar213._20_4_ = fStack_3ec * auVar193._20_4_ * fVar205;
  auVar213._24_4_ = fStack_3e8 * auVar193._24_4_ * fVar206;
  auVar213._28_4_ = fVar120;
  auVar168 = vsubps_avx(auVar209,auVar213);
  fVar153 = (float)local_6e0._0_4_ * (float)local_520._0_4_;
  fVar158 = (float)local_6e0._4_4_ * (float)local_520._4_4_;
  auVar53._4_4_ = fVar158;
  auVar53._0_4_ = fVar153;
  fVar159 = fStack_6d8 * fStack_518;
  auVar53._8_4_ = fVar159;
  fVar160 = fStack_6d4 * fStack_514;
  auVar53._12_4_ = fVar160;
  fVar161 = (float)uStack_6d0 * (float)uStack_510;
  auVar53._16_4_ = fVar161;
  fVar162 = uStack_6d0._4_4_ * uStack_510._4_4_;
  auVar53._20_4_ = fVar162;
  fVar163 = (float)uStack_6c8 * (float)uStack_508;
  auVar53._24_4_ = fVar163;
  auVar53._28_4_ = fVar120;
  auVar98._0_4_ = fVar124 * auVar193._0_4_ * fVar153 + auVar168._0_4_;
  auVar98._4_4_ = fVar16 * auVar193._4_4_ * fVar158 + auVar168._4_4_;
  auVar98._8_4_ = fVar22 * auVar193._8_4_ * fVar159 + auVar168._8_4_;
  auVar98._12_4_ = fVar28 * auVar193._12_4_ * fVar160 + auVar168._12_4_;
  auVar98._16_4_ = fVar34 * auVar193._16_4_ * fVar161 + auVar168._16_4_;
  auVar98._20_4_ = fVar40 * auVar193._20_4_ * fVar162 + auVar168._20_4_;
  auVar98._24_4_ = fVar46 * auVar193._24_4_ * fVar163 + auVar168._24_4_;
  auVar98._28_4_ = uStack_6c8._4_4_ + auVar168._28_4_;
  auVar54._4_4_ = fVar142 * (fVar171 * fVar171 + fVar129 * fVar129 + fVar128 * fVar128);
  auVar54._0_4_ = fVar134 * (fVar164 * fVar164 + fVar121 * fVar121 + fVar103 * fVar103);
  auVar54._8_4_ = fVar143 * (fVar172 * fVar172 + fVar21 * fVar21 + fVar20 * fVar20);
  auVar54._12_4_ = fVar144 * (fVar173 * fVar173 + fVar27 * fVar27 + fVar26 * fVar26);
  auVar54._16_4_ = fVar145 * (fVar174 * fVar174 + fVar33 * fVar33 + fVar32 * fVar32);
  auVar54._20_4_ = fVar146 * (fVar175 * fVar175 + fVar39 * fVar39 + fVar38 * fVar38);
  auVar54._24_4_ = fVar147 * (fVar176 * fVar176 + fVar45 * fVar45 + fVar44 * fVar44);
  auVar54._28_4_ = auVar168._28_4_;
  auVar55._4_4_ = fStack_3fc * fVar201 * fVar201;
  auVar55._0_4_ = local_400 * fVar196 * fVar196;
  auVar55._8_4_ = fStack_3f8 * fVar202 * fVar202;
  auVar55._12_4_ = fStack_3f4 * fVar203 * fVar203;
  auVar55._16_4_ = fStack_3f0 * fVar204 * fVar204;
  auVar55._20_4_ = fStack_3ec * fVar205 * fVar205;
  auVar55._24_4_ = fStack_3e8 * fVar206 * fVar206;
  auVar55._28_4_ = fVar56 + fVar56 + fStack_5e4;
  auVar168 = vsubps_avx(auVar54,auVar55);
  auVar49._4_4_ = fVar201 * (fVar16 + fVar16);
  auVar49._0_4_ = fVar196 * (fVar124 + fVar124);
  auVar49._8_4_ = fVar202 * (fVar22 + fVar22);
  auVar49._12_4_ = fVar203 * (fVar28 + fVar28);
  auVar49._16_4_ = fVar204 * (fVar34 + fVar34);
  auVar49._20_4_ = fVar205 * (fVar40 + fVar40);
  auVar49._24_4_ = fVar206 * (fVar46 + fVar46);
  auVar49._28_4_ = auVar216._28_4_ + auVar216._28_4_;
  auVar216 = vsubps_avx(auVar49,auVar53);
  fVar130 = auVar216._28_4_;
  local_5a0._0_4_ = auVar193._0_4_ * auVar193._0_4_;
  local_5a0._4_4_ = auVar193._4_4_ * auVar193._4_4_;
  fStack_598 = auVar193._8_4_ * auVar193._8_4_;
  fStack_594 = auVar193._12_4_ * auVar193._12_4_;
  fStack_590 = auVar193._16_4_ * auVar193._16_4_;
  fStack_58c = auVar193._20_4_ * auVar193._20_4_;
  fStack_588 = auVar193._24_4_ * auVar193._24_4_;
  auVar50._4_4_ = (float)local_5a0._4_4_ * fStack_3fc;
  auVar50._0_4_ = (float)local_5a0._0_4_ * local_400;
  auVar50._8_4_ = fStack_598 * fStack_3f8;
  auVar50._12_4_ = fStack_594 * fStack_3f4;
  auVar50._16_4_ = fStack_590 * fStack_3f0;
  auVar50._20_4_ = fStack_58c * fStack_3ec;
  auVar50._24_4_ = fStack_588 * fStack_3e8;
  auVar50._28_4_ = fVar130;
  auVar178 = vsubps_avx(_local_280,auVar50);
  auVar51._4_4_ = auVar178._4_4_ * (auVar168._4_4_ + fVar158 * auVar216._4_4_);
  auVar51._0_4_ = auVar178._0_4_ * (auVar168._0_4_ + fVar153 * auVar216._0_4_);
  auVar51._8_4_ = auVar178._8_4_ * (auVar168._8_4_ + fVar159 * auVar216._8_4_);
  auVar51._12_4_ = auVar178._12_4_ * (auVar168._12_4_ + fVar160 * auVar216._12_4_);
  auVar51._16_4_ = auVar178._16_4_ * (auVar168._16_4_ + fVar161 * auVar216._16_4_);
  auVar51._20_4_ = auVar178._20_4_ * (auVar168._20_4_ + fVar162 * auVar216._20_4_);
  auVar51._24_4_ = auVar178._24_4_ * (auVar168._24_4_ + fVar163 * auVar216._24_4_);
  auVar51._28_4_ = auVar168._28_4_ + fVar130;
  auVar52._4_4_ = auVar98._4_4_ * auVar98._4_4_;
  auVar52._0_4_ = auVar98._0_4_ * auVar98._0_4_;
  auVar52._8_4_ = auVar98._8_4_ * auVar98._8_4_;
  auVar52._12_4_ = auVar98._12_4_ * auVar98._12_4_;
  auVar52._16_4_ = auVar98._16_4_ * auVar98._16_4_;
  auVar52._20_4_ = auVar98._20_4_ * auVar98._20_4_;
  auVar52._24_4_ = auVar98._24_4_ * auVar98._24_4_;
  auVar52._28_4_ = fVar130;
  auVar168 = vsubps_avx(auVar52,auVar51);
  auVar216 = vcmpps_avx(auVar168,ZEXT432(0) << 0x20,5);
  auVar182 = auVar216 & ~auVar96;
  if ((((((((auVar182 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
           (auVar182 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
          (auVar182 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
         SUB321(auVar182 >> 0x7f,0) != '\0') ||
        (auVar182 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
       SUB321(auVar182 >> 0xbf,0) != '\0') ||
      (auVar182 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar182[0x1f] < '\0')
  {
    auVar182 = vandnps_avx(auVar96,auVar216);
    auVar213 = vsubps_avx(auVar199,_local_600);
    auVar53 = vsubps_avx(auVar132,auVar215);
    auVar54 = vsubps_avx(auVar97,auVar165);
    fStack_584 = uStack_508._4_4_;
    fVar163 = fVar195 * auVar213._0_4_ + auVar54._0_4_ * fVar190 + fVar194 * auVar53._0_4_;
    fVar184 = fVar127 * auVar213._4_4_ + auVar54._4_4_ * fVar125 + fVar126 * auVar53._4_4_;
    fVar185 = fVar19 * auVar213._8_4_ + auVar54._8_4_ * fVar17 + fVar18 * auVar53._8_4_;
    fVar186 = fVar25 * auVar213._12_4_ + auVar54._12_4_ * fVar23 + fVar24 * auVar53._12_4_;
    fVar187 = fVar31 * auVar213._16_4_ + auVar54._16_4_ * fVar29 + fVar30 * auVar53._16_4_;
    fVar188 = fVar37 * auVar213._20_4_ + auVar54._20_4_ * fVar35 + fVar36 * auVar53._20_4_;
    fVar189 = fVar43 * auVar213._24_4_ + auVar54._24_4_ * fVar41 + fVar42 * auVar53._24_4_;
    auVar168 = vsqrtps_avx(auVar168);
    auVar216 = vrcpps_avx(auVar178);
    fVar130 = auVar216._0_4_;
    fVar153 = auVar216._4_4_;
    auVar57._4_4_ = auVar178._4_4_ * fVar153;
    auVar57._0_4_ = auVar178._0_4_ * fVar130;
    fVar158 = auVar216._8_4_;
    auVar57._8_4_ = auVar178._8_4_ * fVar158;
    fVar159 = auVar216._12_4_;
    auVar57._12_4_ = auVar178._12_4_ * fVar159;
    fVar160 = auVar216._16_4_;
    auVar57._16_4_ = auVar178._16_4_ * fVar160;
    fVar161 = auVar216._20_4_;
    auVar57._20_4_ = auVar178._20_4_ * fVar161;
    fVar162 = auVar216._24_4_;
    auVar57._24_4_ = auVar178._24_4_ * fVar162;
    auVar57._28_4_ = auVar213._28_4_;
    auVar138._8_4_ = 0x3f800000;
    auVar138._0_8_ = 0x3f8000003f800000;
    auVar138._12_4_ = 0x3f800000;
    auVar138._16_4_ = 0x3f800000;
    auVar138._20_4_ = 0x3f800000;
    auVar138._24_4_ = 0x3f800000;
    auVar138._28_4_ = 0x3f800000;
    auVar216 = vsubps_avx(auVar138,auVar57);
    auVar105._8_4_ = 0x7fffffff;
    auVar105._0_8_ = 0x7fffffff7fffffff;
    auVar105._12_4_ = 0x7fffffff;
    auVar105._16_4_ = 0x7fffffff;
    auVar105._20_4_ = 0x7fffffff;
    auVar105._24_4_ = 0x7fffffff;
    auVar105._28_4_ = 0x7fffffff;
    fVar130 = fVar130 + fVar130 * auVar216._0_4_;
    fVar153 = fVar153 + fVar153 * auVar216._4_4_;
    fVar158 = fVar158 + fVar158 * auVar216._8_4_;
    fVar159 = fVar159 + fVar159 * auVar216._12_4_;
    fVar160 = fVar160 + fVar160 * auVar216._16_4_;
    fVar161 = fVar161 + fVar161 * auVar216._20_4_;
    fVar162 = fVar162 + fVar162 * auVar216._24_4_;
    auVar216 = vandps_avx(auVar178,auVar105);
    auVar150._8_4_ = 0x219392ef;
    auVar150._0_8_ = 0x219392ef219392ef;
    auVar150._12_4_ = 0x219392ef;
    auVar150._16_4_ = 0x219392ef;
    auVar150._20_4_ = 0x219392ef;
    auVar150._24_4_ = 0x219392ef;
    auVar150._28_4_ = 0x219392ef;
    auVar216 = vcmpps_avx(auVar216,auVar150,2);
    uVar92 = CONCAT44(auVar98._4_4_,auVar98._0_4_);
    auVar151._0_8_ = uVar92 ^ 0x8000000080000000;
    auVar151._8_4_ = -auVar98._8_4_;
    auVar151._12_4_ = -auVar98._12_4_;
    auVar151._16_4_ = -auVar98._16_4_;
    auVar151._20_4_ = -auVar98._20_4_;
    auVar151._24_4_ = -auVar98._24_4_;
    auVar151._28_4_ = -auVar98._28_4_;
    auVar178 = vsubps_avx(auVar151,auVar168);
    auVar209 = vsubps_avx(auVar168,auVar98);
    auVar58._4_4_ = auVar178._4_4_ * fVar153;
    auVar58._0_4_ = auVar178._0_4_ * fVar130;
    auVar58._8_4_ = auVar178._8_4_ * fVar158;
    auVar58._12_4_ = auVar178._12_4_ * fVar159;
    auVar58._16_4_ = auVar178._16_4_ * fVar160;
    auVar58._20_4_ = auVar178._20_4_ * fVar161;
    auVar58._24_4_ = auVar178._24_4_ * fVar162;
    auVar58._28_4_ = auVar178._28_4_;
    auVar59._4_4_ = auVar209._4_4_ * fVar153;
    auVar59._0_4_ = auVar209._0_4_ * fVar130;
    auVar59._8_4_ = auVar209._8_4_ * fVar158;
    auVar59._12_4_ = auVar209._12_4_ * fVar159;
    auVar59._16_4_ = auVar209._16_4_ * fVar160;
    auVar59._20_4_ = auVar209._20_4_ * fVar161;
    auVar59._24_4_ = auVar209._24_4_ * fVar162;
    auVar59._28_4_ = auVar209._28_4_;
    auVar99._8_4_ = 0xff800000;
    auVar99._0_8_ = 0xff800000ff800000;
    auVar99._12_4_ = 0xff800000;
    auVar99._16_4_ = 0xff800000;
    auVar99._20_4_ = 0xff800000;
    auVar99._24_4_ = 0xff800000;
    auVar99._28_4_ = 0xff800000;
    auVar168 = vblendvps_avx(auVar58,auVar99,auVar216);
    auVar133._8_4_ = 0x7f800000;
    auVar133._0_8_ = 0x7f8000007f800000;
    auVar133._12_4_ = 0x7f800000;
    auVar133._16_4_ = 0x7f800000;
    auVar133._20_4_ = 0x7f800000;
    auVar133._24_4_ = 0x7f800000;
    auVar133._28_4_ = 0x7f800000;
    auVar178 = vblendvps_avx(auVar59,auVar133,auVar216);
    auVar166._0_4_ = fVar196 + auVar193._0_4_ * auVar168._0_4_;
    auVar166._4_4_ = fVar201 + auVar193._4_4_ * auVar168._4_4_;
    auVar166._8_4_ = fVar202 + auVar193._8_4_ * auVar168._8_4_;
    auVar166._12_4_ = fVar203 + auVar193._12_4_ * auVar168._12_4_;
    auVar166._16_4_ = fVar204 + auVar193._16_4_ * auVar168._16_4_;
    auVar166._20_4_ = fVar205 + auVar193._20_4_ * auVar168._20_4_;
    auVar166._24_4_ = fVar206 + auVar193._24_4_ * auVar168._24_4_;
    auVar166._28_4_ = fVar207 + auVar209._28_4_;
    auVar216 = vcmpps_avx(auVar166,ZEXT832(0) << 0x20,6);
    auVar209 = vcmpps_avx(auVar166,_local_520,1);
    auVar216 = vandps_avx(auVar209,auVar216);
    auVar216 = vandps_avx(auVar182,auVar216);
    local_480 = vblendvps_avx(auVar133,auVar168,auVar216);
    local_3e0._0_4_ = fVar196 + auVar193._0_4_ * auVar178._0_4_;
    local_3e0._4_4_ = fVar201 + auVar193._4_4_ * auVar178._4_4_;
    fStack_3d8 = fVar202 + auVar193._8_4_ * auVar178._8_4_;
    fStack_3d4 = fVar203 + auVar193._12_4_ * auVar178._12_4_;
    fStack_3d0 = fVar204 + auVar193._16_4_ * auVar178._16_4_;
    fStack_3cc = fVar205 + auVar193._20_4_ * auVar178._20_4_;
    fStack_3c8 = fVar206 + auVar193._24_4_ * auVar178._24_4_;
    register0x0000145c = fVar207 + local_480._28_4_;
    auVar216 = vcmpps_avx(_local_3e0,ZEXT832(0) << 0x20,6);
    auVar168 = vcmpps_avx(_local_3e0,_local_520,1);
    auVar216 = vandps_avx(auVar168,auVar216);
    auVar216 = vandps_avx(auVar182,auVar216);
    _local_600 = vblendvps_avx(auVar99,auVar178,auVar216);
    auVar178 = vrcpps_avx(auVar193);
    fVar130 = auVar178._0_4_;
    fVar153 = auVar178._4_4_;
    auVar60._4_4_ = auVar193._4_4_ * fVar153;
    auVar60._0_4_ = auVar193._0_4_ * fVar130;
    fVar158 = auVar178._8_4_;
    auVar60._8_4_ = auVar193._8_4_ * fVar158;
    fVar159 = auVar178._12_4_;
    auVar60._12_4_ = auVar193._12_4_ * fVar159;
    fVar160 = auVar178._16_4_;
    auVar60._16_4_ = auVar193._16_4_ * fVar160;
    fVar161 = auVar178._20_4_;
    auVar60._20_4_ = auVar193._20_4_ * fVar161;
    fVar162 = auVar178._24_4_;
    auVar60._24_4_ = auVar193._24_4_ * fVar162;
    auVar60._28_4_ = auVar216._28_4_;
    auVar55 = vsubps_avx(auVar138,auVar60);
    fVar130 = fVar130 + fVar130 * auVar55._0_4_;
    fVar153 = fVar153 + fVar153 * auVar55._4_4_;
    fVar158 = fVar158 + fVar158 * auVar55._8_4_;
    fVar159 = fVar159 + fVar159 * auVar55._12_4_;
    fVar160 = fVar160 + fVar160 * auVar55._16_4_;
    fVar161 = fVar161 + fVar161 * auVar55._20_4_;
    fVar162 = fVar162 + fVar162 * auVar55._24_4_;
    auVar61._4_4_ = auVar193._4_4_ * fVar171;
    auVar61._0_4_ = auVar193._0_4_ * fVar164;
    auVar61._8_4_ = auVar193._8_4_ * fVar172;
    auVar61._12_4_ = auVar193._12_4_ * fVar173;
    auVar61._16_4_ = auVar193._16_4_ * fVar174;
    auVar61._20_4_ = auVar193._20_4_ * fVar175;
    auVar61._24_4_ = auVar193._24_4_ * fVar176;
    auVar61._28_4_ = auVar55._28_4_;
    auVar62._4_4_ = fStack_458 * fVar201;
    auVar62._0_4_ = fStack_458 * fVar196;
    auVar62._8_4_ = fStack_458 * fVar202;
    auVar62._12_4_ = fStack_458 * fVar203;
    auVar62._16_4_ = fStack_458 * fVar204;
    auVar62._20_4_ = fStack_458 * fVar205;
    auVar62._24_4_ = fStack_458 * fVar206;
    auVar62._28_4_ = auVar168._28_4_;
    auVar216 = vsubps_avx(auVar61,auVar62);
    auVar63._4_4_ = auVar193._4_4_ * fVar129;
    auVar63._0_4_ = auVar193._0_4_ * fVar121;
    auVar63._8_4_ = auVar193._8_4_ * fVar21;
    auVar63._12_4_ = auVar193._12_4_ * fVar27;
    auVar63._16_4_ = auVar193._16_4_ * fVar33;
    auVar63._20_4_ = auVar193._20_4_ * fVar39;
    auVar63._24_4_ = auVar193._24_4_ * fVar45;
    auVar63._28_4_ = auVar168._28_4_;
    auVar64._4_4_ = local_680 * fVar201;
    auVar64._0_4_ = local_680 * fVar196;
    auVar64._8_4_ = local_680 * fVar202;
    auVar64._12_4_ = local_680 * fVar203;
    auVar64._16_4_ = local_680 * fVar204;
    auVar64._20_4_ = local_680 * fVar205;
    auVar64._24_4_ = local_680 * fVar206;
    auVar64._28_4_ = auVar209._28_4_;
    auVar49 = vsubps_avx(auVar63,auVar64);
    auVar65._4_4_ = auVar193._4_4_ * fVar128;
    auVar65._0_4_ = auVar193._0_4_ * fVar103;
    auVar65._8_4_ = auVar193._8_4_ * fVar20;
    auVar65._12_4_ = auVar193._12_4_ * fVar26;
    auVar65._16_4_ = auVar193._16_4_ * fVar32;
    auVar65._20_4_ = auVar193._20_4_ * fVar38;
    auVar65._24_4_ = auVar193._24_4_ * fVar44;
    auVar65._28_4_ = auVar209._28_4_;
    auVar66._4_4_ = fVar201 * local_260;
    auVar66._0_4_ = fVar196 * local_260;
    auVar66._8_4_ = fVar202 * local_260;
    auVar66._12_4_ = fVar203 * local_260;
    auVar66._16_4_ = fVar204 * local_260;
    auVar66._20_4_ = fVar205 * local_260;
    auVar66._24_4_ = fVar206 * local_260;
    auVar66._28_4_ = 0x3f800000;
    auVar168 = vsubps_avx(auVar65,auVar66);
    auVar112._0_4_ =
         auVar216._0_4_ * auVar216._0_4_ +
         auVar49._0_4_ * auVar49._0_4_ + auVar168._0_4_ * auVar168._0_4_;
    auVar112._4_4_ =
         auVar216._4_4_ * auVar216._4_4_ +
         auVar49._4_4_ * auVar49._4_4_ + auVar168._4_4_ * auVar168._4_4_;
    auVar112._8_4_ =
         auVar216._8_4_ * auVar216._8_4_ +
         auVar49._8_4_ * auVar49._8_4_ + auVar168._8_4_ * auVar168._8_4_;
    auVar112._12_4_ =
         auVar216._12_4_ * auVar216._12_4_ +
         auVar49._12_4_ * auVar49._12_4_ + auVar168._12_4_ * auVar168._12_4_;
    auVar112._16_4_ =
         auVar216._16_4_ * auVar216._16_4_ +
         auVar49._16_4_ * auVar49._16_4_ + auVar168._16_4_ * auVar168._16_4_;
    auVar112._20_4_ =
         auVar216._20_4_ * auVar216._20_4_ +
         auVar49._20_4_ * auVar49._20_4_ + auVar168._20_4_ * auVar168._20_4_;
    auVar112._24_4_ =
         auVar216._24_4_ * auVar216._24_4_ +
         auVar49._24_4_ * auVar49._24_4_ + auVar168._24_4_ * auVar168._24_4_;
    auVar112._28_4_ = auVar216._28_4_ + auVar49._28_4_ + auVar168._28_4_;
    auVar67._4_4_ = (float)local_5a0._4_4_ * (float)local_6e0._4_4_ * (float)local_6e0._4_4_;
    auVar67._0_4_ = (float)local_5a0._0_4_ * (float)local_6e0._0_4_ * (float)local_6e0._0_4_;
    auVar67._8_4_ = fStack_598 * fStack_6d8 * fStack_6d8;
    auVar67._12_4_ = fStack_594 * fStack_6d4 * fStack_6d4;
    auVar67._16_4_ = fStack_590 * (float)uStack_6d0 * (float)uStack_6d0;
    auVar67._20_4_ = fStack_58c * uStack_6d0._4_4_ * uStack_6d0._4_4_;
    auVar67._24_4_ = fStack_588 * (float)uStack_6c8 * (float)uStack_6c8;
    auVar67._28_4_ = uStack_6c8._4_4_;
    auVar216 = vcmpps_avx(auVar112,auVar67,1);
    auVar68._4_4_ = fVar153 * -fVar201;
    auVar68._0_4_ = fVar130 * -fVar196;
    auVar68._8_4_ = fVar158 * -fVar202;
    auVar68._12_4_ = fVar159 * -fVar203;
    auVar68._16_4_ = fVar160 * -fVar204;
    auVar68._20_4_ = fVar161 * -fVar205;
    auVar68._24_4_ = fVar162 * -fVar206;
    auVar68._28_4_ = -fVar207;
    auVar168 = vblendvps_avx(auVar133,auVar68,auVar216);
    auVar139._16_16_ = *(undefined1 (*) [16])(mm_lookupmask_ps + (line->leftExists & 0xfffffff0));
    auVar139._0_16_ = *(undefined1 (*) [16])(mm_lookupmask_ps + ((line->leftExists & 0xf) << 4));
    auVar216 = vandnps_avx(auVar139,auVar182);
    _local_5e0 = vblendvps_avx(auVar133,auVar168,auVar216);
    auVar113._16_16_ = *(undefined1 (*) [16])(mm_lookupmask_ps + (line->rightExists & 0xfffffff0));
    auVar113._0_16_ = *(undefined1 (*) [16])(mm_lookupmask_ps + ((line->rightExists & 0xf) << 4));
    auVar69._4_4_ = auVar193._4_4_ * auVar213._4_4_;
    auVar69._0_4_ = auVar193._0_4_ * auVar213._0_4_;
    auVar69._8_4_ = auVar193._8_4_ * auVar213._8_4_;
    auVar69._12_4_ = auVar193._12_4_ * auVar213._12_4_;
    auVar69._16_4_ = auVar193._16_4_ * auVar213._16_4_;
    auVar69._20_4_ = auVar193._20_4_ * auVar213._20_4_;
    auVar69._24_4_ = auVar193._24_4_ * auVar213._24_4_;
    auVar69._28_4_ = auVar216._28_4_;
    auVar70._4_4_ = auVar193._4_4_ * auVar53._4_4_;
    auVar70._0_4_ = auVar193._0_4_ * auVar53._0_4_;
    auVar70._8_4_ = auVar193._8_4_ * auVar53._8_4_;
    auVar70._12_4_ = auVar193._12_4_ * auVar53._12_4_;
    auVar70._16_4_ = auVar193._16_4_ * auVar53._16_4_;
    auVar70._20_4_ = auVar193._20_4_ * auVar53._20_4_;
    auVar70._24_4_ = auVar193._24_4_ * auVar53._24_4_;
    auVar70._28_4_ = auVar49._28_4_;
    auVar71._4_4_ = auVar193._4_4_ * auVar54._4_4_;
    auVar71._0_4_ = auVar193._0_4_ * auVar54._0_4_;
    auVar71._8_4_ = auVar193._8_4_ * auVar54._8_4_;
    auVar71._12_4_ = auVar193._12_4_ * auVar54._12_4_;
    auVar71._16_4_ = auVar193._16_4_ * auVar54._16_4_;
    auVar71._20_4_ = auVar193._20_4_ * auVar54._20_4_;
    auVar71._24_4_ = auVar193._24_4_ * auVar54._24_4_;
    auVar71._28_4_ = 0;
    auVar72._4_4_ = fStack_458 * fVar184;
    auVar72._0_4_ = fStack_458 * fVar163;
    auVar72._8_4_ = fStack_458 * fVar185;
    auVar72._12_4_ = fStack_458 * fVar186;
    auVar72._16_4_ = fStack_458 * fVar187;
    auVar72._20_4_ = fStack_458 * fVar188;
    uVar90 = auVar54._28_4_;
    auVar72._24_4_ = fStack_458 * fVar189;
    auVar72._28_4_ = uVar90;
    auVar216 = vsubps_avx(auVar69,auVar72);
    auVar73._4_4_ = local_680 * fVar184;
    auVar73._0_4_ = local_680 * fVar163;
    auVar73._8_4_ = local_680 * fVar185;
    auVar73._12_4_ = local_680 * fVar186;
    auVar73._16_4_ = local_680 * fVar187;
    auVar73._20_4_ = local_680 * fVar188;
    auVar73._24_4_ = local_680 * fVar189;
    auVar73._28_4_ = uVar90;
    auVar168 = vsubps_avx(auVar70,auVar73);
    auVar74._4_4_ = fVar184 * local_260;
    auVar74._0_4_ = fVar163 * local_260;
    auVar74._8_4_ = fVar185 * local_260;
    auVar74._12_4_ = fVar186 * local_260;
    auVar74._16_4_ = fVar187 * local_260;
    auVar74._20_4_ = fVar188 * local_260;
    auVar74._24_4_ = fVar189 * local_260;
    auVar74._28_4_ = uVar90;
    auVar209 = vsubps_avx(auVar71,auVar74);
    auVar100._0_4_ =
         auVar216._0_4_ * auVar216._0_4_ +
         auVar168._0_4_ * auVar168._0_4_ + auVar209._0_4_ * auVar209._0_4_;
    auVar100._4_4_ =
         auVar216._4_4_ * auVar216._4_4_ +
         auVar168._4_4_ * auVar168._4_4_ + auVar209._4_4_ * auVar209._4_4_;
    auVar100._8_4_ =
         auVar216._8_4_ * auVar216._8_4_ +
         auVar168._8_4_ * auVar168._8_4_ + auVar209._8_4_ * auVar209._8_4_;
    auVar100._12_4_ =
         auVar216._12_4_ * auVar216._12_4_ +
         auVar168._12_4_ * auVar168._12_4_ + auVar209._12_4_ * auVar209._12_4_;
    auVar100._16_4_ =
         auVar216._16_4_ * auVar216._16_4_ +
         auVar168._16_4_ * auVar168._16_4_ + auVar209._16_4_ * auVar209._16_4_;
    auVar100._20_4_ =
         auVar216._20_4_ * auVar216._20_4_ +
         auVar168._20_4_ * auVar168._20_4_ + auVar209._20_4_ * auVar209._20_4_;
    auVar100._24_4_ =
         auVar216._24_4_ * auVar216._24_4_ +
         auVar168._24_4_ * auVar168._24_4_ + auVar209._24_4_ * auVar209._24_4_;
    auVar100._28_4_ = auVar216._28_4_ + auVar168._28_4_ + auVar209._28_4_;
    auVar75._4_4_ = (float)local_5a0._4_4_ * auVar94._4_4_ * auVar94._4_4_;
    auVar75._0_4_ = (float)local_5a0._0_4_ * auVar94._0_4_ * auVar94._0_4_;
    auVar75._8_4_ = fStack_598 * auVar94._8_4_ * auVar94._8_4_;
    auVar75._12_4_ = fStack_594 * auVar94._12_4_ * auVar94._12_4_;
    auVar75._16_4_ = fStack_590 * auVar95._16_4_ * auVar95._16_4_;
    auVar75._20_4_ = fStack_58c * auVar95._20_4_ * auVar95._20_4_;
    auVar75._24_4_ = fStack_588 * auVar95._24_4_ * auVar95._24_4_;
    auVar75._28_4_ = auVar95._28_4_;
    uVar88 = *(uint *)(ray + k * 4 + 0x100);
    auVar47 = vshufps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x60)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0);
    auVar216 = vandnps_avx(auVar113,auVar182);
    auVar168 = vcmpps_avx(auVar100,auVar75,1);
    auVar76._4_4_ = fVar153 * -fVar184;
    auVar76._0_4_ = fVar130 * -fVar163;
    auVar76._8_4_ = fVar158 * -fVar185;
    auVar76._12_4_ = fVar159 * -fVar186;
    auVar76._16_4_ = fVar160 * -fVar187;
    auVar76._20_4_ = fVar161 * -fVar188;
    auVar76._24_4_ = fVar162 * -fVar189;
    auVar76._28_4_ = auVar178._28_4_ + auVar55._28_4_;
    auVar168 = vblendvps_avx(auVar133,auVar76,auVar168);
    auVar216 = vblendvps_avx(auVar133,auVar168,auVar216);
    auVar209 = vminps_avx(_local_5e0,auVar216);
    auVar168 = vmaxps_avx(_local_5e0,auVar216);
    auVar213 = vminps_avx(local_480,auVar209);
    auVar178 = vcmpps_avx(auVar213,auVar209,0);
    auVar216 = vcmpps_avx(auVar168,auVar133,0);
    auVar200._8_4_ = 0xff800000;
    auVar200._0_8_ = 0xff800000ff800000;
    auVar200._12_4_ = 0xff800000;
    auVar200._16_4_ = 0xff800000;
    auVar200._20_4_ = 0xff800000;
    auVar200._24_4_ = 0xff800000;
    auVar200._28_4_ = 0xff800000;
    auVar216 = vblendvps_avx(auVar168,auVar200,auVar216);
    auVar168 = vcmpps_avx(auVar209,auVar133,0);
    auVar168 = vblendvps_avx(auVar209,auVar200,auVar168);
    auVar168 = vblendvps_avx(auVar168,auVar216,auVar178);
    auVar114._16_16_ = auVar47;
    auVar114._0_16_ = auVar47;
    auVar140._0_4_ = (float)local_620._0_4_ + auVar213._0_4_;
    auVar140._4_4_ = (float)local_620._4_4_ + auVar213._4_4_;
    auVar140._8_4_ = fStack_618 + auVar213._8_4_;
    auVar140._12_4_ = fStack_614 + auVar213._12_4_;
    auVar140._16_4_ = (float)uStack_610 + auVar213._16_4_;
    auVar140._20_4_ = uStack_610._4_4_ + auVar213._20_4_;
    auVar140._24_4_ = (float)uStack_608 + auVar213._24_4_;
    auVar140._28_4_ = uStack_608._4_4_ + auVar213._28_4_;
    auVar216 = vcmpps_avx(auVar114,auVar140,2);
    _local_5a0 = ZEXT416(uVar88);
    auVar47 = vshufps_avx(ZEXT416(uVar88),ZEXT416(uVar88),0);
    auVar155._16_16_ = auVar47;
    auVar155._0_16_ = auVar47;
    auVar178 = vcmpps_avx(auVar140,auVar155,2);
    auVar216 = vandps_avx(auVar178,auVar216);
    local_540 = vmaxps_avx(_local_600,auVar168);
    auVar168 = vcmpps_avx(auVar213,auVar133,4);
    auVar168 = vandps_avx(auVar182,auVar168);
    local_560 = vandps_avx(auVar216,auVar168);
    local_4a0._0_4_ = (float)local_620._0_4_ + local_540._0_4_;
    local_4a0._4_4_ = (float)local_620._4_4_ + local_540._4_4_;
    local_4a0._8_4_ = fStack_618 + local_540._8_4_;
    local_4a0._12_4_ = fStack_614 + local_540._12_4_;
    local_4a0._16_4_ = (float)uStack_610 + local_540._16_4_;
    local_4a0._20_4_ = uStack_610._4_4_ + local_540._20_4_;
    local_4a0._24_4_ = (float)uStack_608 + local_540._24_4_;
    local_4a0._28_4_ = uStack_608._4_4_ + local_540._28_4_;
    auVar216 = vcmpps_avx(auVar114,local_4a0,2);
    auVar168 = vcmpps_avx(local_4a0,auVar155,2);
    auVar216 = vandps_avx(auVar168,auVar216);
    auVar168 = vcmpps_avx(local_540,auVar200,4);
    auVar168 = vandps_avx(auVar182,auVar168);
    local_380 = vandps_avx(auVar216,auVar168);
    auVar216 = vorps_avx(local_560,local_380);
    if ((((((((auVar216 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar216 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar216 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar216 >> 0x7f,0) != '\0') ||
          (auVar216 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar216 >> 0xbf,0) != '\0') ||
        (auVar216 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        auVar216[0x1f] < '\0') {
      auVar209 = vblendvps_avx(local_540,auVar213,local_560);
      auVar213 = vblendvps_avx(_local_3e0,auVar166,local_560);
      local_6e0._0_4_ = (float)local_520._0_4_ * fVar124 * (float)local_6e0._0_4_;
      local_6e0._4_4_ = (float)local_520._4_4_ * fVar16 * (float)local_6e0._4_4_;
      fStack_6d8 = fStack_518 * fVar22 * fStack_6d8;
      fStack_6d4 = fStack_514 * fVar28 * fStack_6d4;
      uStack_6d0._0_4_ = (float)uStack_510 * fVar34 * (float)uStack_6d0;
      uStack_6d0._4_4_ = uStack_510._4_4_ * fVar40 * uStack_6d0._4_4_;
      uStack_6c8._0_4_ = (float)uStack_508 * fVar46 * (float)uStack_6c8;
      auVar168 = vcmpps_avx(local_480,auVar209,0);
      auVar53 = vcmpps_avx(auVar209,_local_600,0);
      auVar168 = vorps_avx(auVar168,auVar53);
      auVar168 = vandps_avx(auVar182,auVar168);
      auVar54 = vcmpps_avx(auVar209,_local_5e0,0);
      auVar178 = vandps_avx(auVar182,auVar54);
      fVar124 = auVar209._0_4_;
      fVar16 = auVar209._4_4_;
      fVar22 = auVar209._8_4_;
      fVar28 = auVar209._12_4_;
      fVar34 = auVar209._16_4_;
      fVar40 = auVar209._20_4_;
      fVar46 = auVar209._24_4_;
      fStack_41c = fVar127 * (float)local_6e0._4_4_;
      local_420 = fVar195 * (float)local_6e0._0_4_;
      fStack_418 = fVar19 * fStack_6d8;
      fStack_414 = fVar25 * fStack_6d4;
      fStack_410 = fVar31 * (float)uStack_6d0;
      fStack_40c = fVar37 * uStack_6d0._4_4_;
      fStack_408 = fVar43 * (float)uStack_6c8;
      fStack_404 = fStack_458;
      auVar115._0_4_ = fVar195 * (float)local_6e0._0_4_ + fVar134 * (fStack_458 * fVar124 + fVar164)
      ;
      auVar115._4_4_ = fVar127 * (float)local_6e0._4_4_ + fVar142 * (fStack_458 * fVar16 + fVar171);
      auVar115._8_4_ = fVar19 * fStack_6d8 + fVar143 * (fStack_458 * fVar22 + fVar172);
      auVar115._12_4_ = fVar25 * fStack_6d4 + fVar144 * (fStack_458 * fVar28 + fVar173);
      auVar115._16_4_ = fVar31 * (float)uStack_6d0 + fVar145 * (fStack_458 * fVar34 + fVar174);
      auVar115._20_4_ = fVar37 * uStack_6d0._4_4_ + fVar146 * (fStack_458 * fVar40 + fVar175);
      auVar115._24_4_ = fVar43 * (float)uStack_6c8 + fVar147 * (fStack_458 * fVar46 + fVar176);
      auVar115._28_4_ = fStack_458 + auVar54._28_4_ + fStack_5a4;
      fStack_43c = fVar127 * fStack_3fc;
      local_440 = fVar195 * local_400;
      fStack_438 = fVar19 * fStack_3f8;
      fStack_434 = fVar25 * fStack_3f4;
      fStack_430 = fVar31 * fStack_3f0;
      fStack_42c = fVar37 * fStack_3ec;
      fStack_428 = fVar43 * fStack_3e8;
      uStack_424 = auVar216._28_4_;
      fVar130 = auVar213._0_4_;
      fVar153 = auVar213._4_4_;
      auVar77._4_4_ = fVar153 * fVar127 * fStack_3fc;
      auVar77._0_4_ = fVar130 * fVar195 * local_400;
      fVar195 = auVar213._8_4_;
      auVar77._8_4_ = fVar195 * fVar19 * fStack_3f8;
      fVar127 = auVar213._12_4_;
      auVar77._12_4_ = fVar127 * fVar25 * fStack_3f4;
      fVar158 = auVar213._16_4_;
      auVar77._16_4_ = fVar158 * fVar31 * fStack_3f0;
      fVar159 = auVar213._20_4_;
      auVar77._20_4_ = fVar159 * fVar37 * fStack_3ec;
      fVar160 = auVar213._24_4_;
      auVar77._24_4_ = fVar160 * fVar43 * fStack_3e8;
      auVar77._28_4_ = auVar53._28_4_;
      auVar53 = vsubps_avx(auVar115,auVar77);
      local_c0._0_8_ = local_580._0_8_ ^ 0x8000000080000000;
      local_c0._8_4_ = -fVar19;
      local_c0._12_4_ = -fVar25;
      local_c0._16_4_ = -fVar31;
      local_c0._20_4_ = -fVar37;
      local_c0._24_4_ = -fVar43;
      local_c0._28_4_ = local_580._28_4_ ^ 0x80000000;
      auVar182 = vblendvps_avx(local_580,local_c0,auVar178);
      local_3c0 = vblendvps_avx(auVar182,auVar53,auVar168);
      auVar157 = ZEXT3264(local_3a0);
      local_a0 = (float)local_6e0._0_4_ * fVar194;
      fStack_9c = (float)local_6e0._4_4_ * fVar126;
      fStack_98 = fStack_6d8 * fVar18;
      fStack_94 = fStack_6d4 * fVar24;
      fStack_90 = (float)uStack_6d0 * fVar30;
      fStack_8c = uStack_6d0._4_4_ * fVar36;
      fStack_88 = (float)uStack_6c8 * fVar42;
      fStack_84 = -0.0;
      auVar141._0_4_ = (float)local_6e0._0_4_ * fVar194 + fVar134 * (fVar121 + fVar124 * local_680);
      auVar141._4_4_ = (float)local_6e0._4_4_ * fVar126 + fVar142 * (fVar129 + fVar16 * local_680);
      auVar141._8_4_ = fStack_6d8 * fVar18 + fVar143 * (fVar21 + fVar22 * local_680);
      auVar141._12_4_ = fStack_6d4 * fVar24 + fVar144 * (fVar27 + fVar28 * local_680);
      auVar141._16_4_ = (float)uStack_6d0 * fVar30 + fVar145 * (fVar33 + fVar34 * local_680);
      auVar141._20_4_ = uStack_6d0._4_4_ * fVar36 + fVar146 * (fVar39 + fVar40 * local_680);
      auVar141._24_4_ = (float)uStack_6c8 * fVar42 + fVar147 * (fVar45 + fVar46 * local_680);
      auVar141._28_4_ = local_4e0._28_4_ + auVar182._28_4_ + -0.0;
      local_80 = fVar194 * local_400;
      fStack_7c = fVar126 * fStack_3fc;
      fStack_78 = fVar18 * fStack_3f8;
      fStack_74 = fVar24 * fStack_3f4;
      fStack_70 = fVar30 * fStack_3f0;
      fStack_6c = fVar36 * fStack_3ec;
      fStack_68 = fVar42 * fStack_3e8;
      uStack_64 = 0x80000000;
      auVar78._4_4_ = fVar153 * fVar126 * fStack_3fc;
      auVar78._0_4_ = fVar130 * fVar194 * local_400;
      auVar78._8_4_ = fVar195 * fVar18 * fStack_3f8;
      auVar78._12_4_ = fVar127 * fVar24 * fStack_3f4;
      auVar78._16_4_ = fVar158 * fVar30 * fStack_3f0;
      auVar78._20_4_ = fVar159 * fVar36 * fStack_3ec;
      auVar78._24_4_ = fVar160 * fVar42 * fStack_3e8;
      auVar78._28_4_ = local_580._28_4_;
      auVar53 = vsubps_avx(auVar141,auVar78);
      local_120._0_8_ = local_3a0._0_8_ ^ 0x8000000080000000;
      local_120._8_4_ = -fVar18;
      local_120._12_4_ = -fVar24;
      local_120._16_4_ = -fVar30;
      local_120._20_4_ = -fVar36;
      local_120._24_4_ = -fVar42;
      local_120._28_4_ = local_3a0._28_4_ ^ 0x80000000;
      auVar182 = vblendvps_avx(local_3a0,local_120,auVar178);
      local_2c0 = vblendvps_avx(auVar182,auVar53,auVar168);
      local_400 = fVar190 * local_400;
      fStack_3fc = fVar125 * fStack_3fc;
      fStack_3f8 = fVar17 * fStack_3f8;
      fStack_3f4 = fVar23 * fStack_3f4;
      fStack_3f0 = fVar29 * fStack_3f0;
      fStack_3ec = fVar35 * fStack_3ec;
      fStack_3e8 = fVar41 * fStack_3e8;
      local_e0 = fVar190 * (float)local_6e0._0_4_;
      fStack_dc = fVar125 * (float)local_6e0._4_4_;
      fStack_d8 = fVar17 * fStack_6d8;
      fStack_d4 = fVar23 * fStack_6d4;
      fStack_d0 = fVar29 * (float)uStack_6d0;
      fStack_cc = fVar35 * uStack_6d0._4_4_;
      fStack_c8 = fVar41 * (float)uStack_6c8;
      fStack_c4 = auVar182._28_4_;
      auVar167._0_4_ = fVar190 * (float)local_6e0._0_4_ + fVar134 * (local_260 * fVar124 + fVar103);
      auVar167._4_4_ = fVar125 * (float)local_6e0._4_4_ + fVar142 * (local_260 * fVar16 + fVar128);
      auVar167._8_4_ = fVar17 * fStack_6d8 + fVar143 * (local_260 * fVar22 + fVar20);
      auVar167._12_4_ = fVar23 * fStack_6d4 + fVar144 * (local_260 * fVar28 + fVar26);
      auVar167._16_4_ = fVar29 * (float)uStack_6d0 + fVar145 * (local_260 * fVar34 + fVar32);
      auVar167._20_4_ = fVar35 * uStack_6d0._4_4_ + fVar146 * (local_260 * fVar40 + fVar38);
      auVar167._24_4_ = fVar41 * (float)uStack_6c8 + fVar147 * (local_260 * fVar46 + fVar44);
      auVar167._28_4_ = auVar182._28_4_ + local_680 + fVar120;
      auVar53 = vrcpps_avx(_local_520);
      auVar79._4_4_ = fVar153 * fStack_3fc;
      auVar79._0_4_ = fVar130 * local_400;
      auVar79._8_4_ = fVar195 * fStack_3f8;
      auVar79._12_4_ = fVar127 * fStack_3f4;
      auVar79._16_4_ = fVar158 * fStack_3f0;
      auVar79._20_4_ = fVar159 * fStack_3ec;
      auVar79._24_4_ = fVar160 * fStack_3e8;
      auVar79._28_4_ = fVar56;
      auVar54 = vsubps_avx(auVar167,auVar79);
      auVar208._0_8_ = local_4c0._0_8_ ^ 0x8000000080000000;
      auVar208._8_4_ = -fVar17;
      auVar208._12_4_ = -fVar23;
      auVar208._16_4_ = -fVar29;
      auVar208._20_4_ = -fVar35;
      auVar208._24_4_ = -fVar41;
      auVar208._28_4_ = -fVar56;
      auVar210 = ZEXT3264(auVar208);
      auVar182 = vblendvps_avx(local_4c0,auVar208,auVar178);
      local_2a0 = vblendvps_avx(auVar182,auVar54,auVar168);
      local_100 = auVar53._0_4_;
      fStack_fc = auVar53._4_4_;
      auVar80._4_4_ = (float)local_520._4_4_ * fStack_fc;
      auVar80._0_4_ = (float)local_520._0_4_ * local_100;
      fStack_f8 = auVar53._8_4_;
      auVar80._8_4_ = fStack_518 * fStack_f8;
      fStack_f4 = auVar53._12_4_;
      auVar80._12_4_ = fStack_514 * fStack_f4;
      fStack_f0 = auVar53._16_4_;
      auVar80._16_4_ = (float)uStack_510 * fStack_f0;
      fStack_ec = auVar53._20_4_;
      auVar80._20_4_ = uStack_510._4_4_ * fStack_ec;
      fStack_e8 = auVar53._24_4_;
      auVar80._24_4_ = (float)uStack_508 * fStack_e8;
      auVar80._28_4_ = uStack_508._4_4_ + fVar56;
      auVar212._8_4_ = 0x3f800000;
      auVar212._0_8_ = 0x3f8000003f800000;
      auVar212._12_4_ = 0x3f800000;
      auVar212._16_4_ = 0x3f800000;
      auVar212._20_4_ = 0x3f800000;
      auVar212._24_4_ = 0x3f800000;
      auVar212._28_4_ = 0x3f800000;
      auVar182 = vsubps_avx(auVar212,auVar80);
      _local_520 = vblendvps_avx(auVar212,ZEXT832(0) << 0x20,auVar178);
      local_100 = local_100 + local_100 * auVar182._0_4_;
      fStack_fc = fStack_fc + fStack_fc * auVar182._4_4_;
      fStack_f8 = fStack_f8 + fStack_f8 * auVar182._8_4_;
      fStack_f4 = fStack_f4 + fStack_f4 * auVar182._12_4_;
      fStack_f0 = fStack_f0 + fStack_f0 * auVar182._16_4_;
      fStack_ec = fStack_ec + fStack_ec * auVar182._20_4_;
      fStack_e8 = fStack_e8 + fStack_e8 * auVar182._24_4_;
      fStack_e4 = auVar53._28_4_ + auVar182._28_4_;
      auVar81._4_4_ = fVar153 * fStack_fc;
      auVar81._0_4_ = fVar130 * local_100;
      auVar81._8_4_ = fVar195 * fStack_f8;
      auVar81._12_4_ = fVar127 * fStack_f4;
      auVar81._16_4_ = fVar158 * fStack_f0;
      auVar81._20_4_ = fVar159 * fStack_ec;
      auVar81._24_4_ = fVar160 * fStack_e8;
      auVar81._28_4_ = fStack_e4;
      local_340 = vblendvps_avx(_local_520,auVar81,auVar168);
      local_320 = ZEXT832(0) << 0x20;
      local_300._4_4_ = fVar16 + (float)local_620._4_4_;
      local_300._0_4_ = fVar124 + (float)local_620._0_4_;
      fStack_2f8 = fVar22 + fStack_618;
      fStack_2f4 = fVar28 + fStack_614;
      fStack_2f0 = fVar34 + (float)uStack_610;
      fStack_2ec = fVar40 + uStack_610._4_4_;
      fStack_2e8 = fVar46 + (float)uStack_608;
      fStack_2e4 = auVar209._28_4_ + uStack_608._4_4_;
      local_2e0 = local_3c0;
      uVar90 = vmovmskps_avx(auVar216);
      uVar92 = CONCAT44((int)((ulong)lVar91 >> 0x20),uVar90);
      uVar88 = 1 << ((byte)k & 0x1f);
      auVar216 = vcmpps_avx(auVar213,auVar213,0xf);
      auVar217 = ZEXT3264(auVar216);
      auVar170 = ZEXT3264(local_4c0);
      auVar179 = ZEXT3264(local_4e0);
      auVar183 = ZEXT3264(local_500);
      auVar214 = ZEXT3264(_local_5c0);
      local_688 = pSVar89;
      fStack_67c = local_680;
      fStack_678 = local_680;
      fStack_674 = local_680;
      fStack_670 = local_680;
      fStack_66c = local_680;
      fStack_668 = local_680;
      fStack_664 = local_680;
      local_660 = line;
      local_658 = k;
      fStack_454 = fStack_458;
      fStack_450 = fStack_458;
      fStack_44c = fStack_458;
      fStack_448 = fStack_458;
      fStack_444 = fStack_458;
      uStack_3e4 = local_120._28_4_;
      do {
        auVar168 = auVar170._0_32_;
        auVar216 = auVar157._0_32_;
        local_650.valid = (int *)local_6c0;
        auVar182 = auVar183._0_32_;
        auVar178 = auVar179._0_32_;
        auVar213 = auVar214._0_32_;
        auVar209 = auVar210._0_32_;
        uVar15 = 0;
        if (uVar92 != 0) {
          for (; (uVar92 >> uVar15 & 1) == 0; uVar15 = uVar15 + 1) {
          }
        }
        uVar3 = *(uint *)(local_360 + uVar15 * 4);
        pGVar11 = (pSVar89->geometries).items[uVar3].ptr;
        local_650.ray = (RTCRayN *)ray;
        if ((pGVar11->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
          auVar2._4_4_ = fStack_67c;
          auVar2._0_4_ = local_680;
          auVar2._8_4_ = fStack_678;
          auVar2._12_4_ = fStack_674;
          auVar2._16_4_ = fStack_670;
          auVar2._20_4_ = fStack_66c;
          auVar2._24_4_ = fStack_668;
          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
             (bVar93 = true, pGVar11->occlusionFilterN == (RTCFilterFunctionN)0x0))
          goto LAB_00a81d2b;
          local_1e0 = *(undefined4 *)(local_340 + uVar15 * 4);
          local_1c0 = *(undefined4 *)(local_320 + uVar15 * 4);
          *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_300 + uVar15 * 4);
          local_650.context = context->user;
          local_1a0 = (local_660->primIDs).field_0.i[uVar15];
          local_240._4_4_ = *(undefined4 *)(local_2e0 + uVar15 * 4);
          uVar90 = *(undefined4 *)(local_2c0 + uVar15 * 4);
          local_220._4_4_ = uVar90;
          local_220._0_4_ = uVar90;
          local_220._8_4_ = uVar90;
          local_220._12_4_ = uVar90;
          local_220._16_4_ = uVar90;
          local_220._20_4_ = uVar90;
          local_220._24_4_ = uVar90;
          local_220._28_4_ = uVar90;
          local_170 = vpshufd_avx(ZEXT416(uVar3),0);
          local_200._4_4_ = *(undefined4 *)(local_2a0 + uVar15 * 4);
          local_240._0_4_ = local_240._4_4_;
          local_240._8_4_ = local_240._4_4_;
          local_240._12_4_ = local_240._4_4_;
          local_240._16_4_ = local_240._4_4_;
          local_240._20_4_ = local_240._4_4_;
          local_240._24_4_ = local_240._4_4_;
          local_240._28_4_ = local_240._4_4_;
          local_200._0_4_ = local_200._4_4_;
          local_200._8_4_ = local_200._4_4_;
          local_200._12_4_ = local_200._4_4_;
          local_200._16_4_ = local_200._4_4_;
          local_200._20_4_ = local_200._4_4_;
          local_200._24_4_ = local_200._4_4_;
          local_200._28_4_ = local_200._4_4_;
          uStack_1dc = local_1e0;
          uStack_1d8 = local_1e0;
          uStack_1d4 = local_1e0;
          uStack_1d0 = local_1e0;
          uStack_1cc = local_1e0;
          uStack_1c8 = local_1e0;
          uStack_1c4 = local_1e0;
          uStack_1bc = local_1c0;
          uStack_1b8 = local_1c0;
          uStack_1b4 = local_1c0;
          uStack_1b0 = local_1c0;
          uStack_1ac = local_1c0;
          uStack_1a8 = local_1c0;
          uStack_1a4 = local_1c0;
          uStack_19c = local_1a0;
          uStack_198 = local_1a0;
          uStack_194 = local_1a0;
          uStack_190 = local_1a0;
          uStack_18c = local_1a0;
          uStack_188 = local_1a0;
          uStack_184 = local_1a0;
          local_180 = local_170;
          uStack_15c = (local_650.context)->instID[0];
          local_160 = uStack_15c;
          uStack_158 = uStack_15c;
          uStack_154 = uStack_15c;
          uStack_150 = uStack_15c;
          uStack_14c = uStack_15c;
          uStack_148 = uStack_15c;
          uStack_144 = uStack_15c;
          uStack_13c = (local_650.context)->instPrimID[0];
          local_140 = uStack_13c;
          uStack_138 = uStack_13c;
          uStack_134 = uStack_13c;
          uStack_130 = uStack_13c;
          uStack_12c = uStack_13c;
          uStack_128 = uStack_13c;
          uStack_124 = uStack_13c;
          local_6c0 = *(undefined1 (*) [16])(mm_lookupmask_ps + ((uVar88 & 0xf) << 4));
          local_6b0 = *(undefined1 (*) [16])(mm_lookupmask_ps + (long)((int)uVar88 >> 4) * 0x10);
          local_650.geometryUserPtr = pGVar11->userPtr;
          local_650.hit = (RTCHitN *)local_240;
          local_650.N = 8;
          if (pGVar11->occlusionFilterN != (RTCFilterFunctionN)0x0) {
            auVar216 = ZEXT1632(auVar217._0_16_);
            _local_620 = auVar209;
            (*pGVar11->occlusionFilterN)(&local_650);
            auVar216 = vcmpps_avx(auVar216,auVar216,0xf);
            auVar217 = ZEXT3264(auVar216);
            auVar210 = ZEXT3264(_local_620);
            auVar214 = ZEXT3264(_local_5c0);
            auVar183 = ZEXT3264(local_500);
            auVar179 = ZEXT3264(local_4e0);
            auVar170 = ZEXT3264(local_4c0);
            auVar157 = ZEXT3264(local_3a0);
            pSVar89 = local_688;
          }
          auVar109 = ZEXT816(0) << 0x40;
          auVar47 = vpcmpeqd_avx(local_6c0,auVar109);
          auVar48 = vpcmpeqd_avx(local_6b0,auVar109);
          auVar116._16_16_ = auVar48;
          auVar116._0_16_ = auVar47;
          auVar216 = auVar217._0_32_ & ~auVar116;
          if ((((((((auVar216 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar216 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar216 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar216 >> 0x7f,0) == '\0') &&
                (auVar216 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar216 >> 0xbf,0) == '\0') &&
              (auVar216 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar216[0x1f]) {
            auVar101._0_4_ = auVar217._0_4_ ^ auVar47._0_4_;
            auVar101._4_4_ = auVar217._4_4_ ^ auVar47._4_4_;
            auVar101._8_4_ = auVar217._8_4_ ^ auVar47._8_4_;
            auVar101._12_4_ = auVar217._12_4_ ^ auVar47._12_4_;
            auVar101._16_4_ = auVar217._16_4_ ^ auVar48._0_4_;
            auVar101._20_4_ = auVar217._20_4_ ^ auVar48._4_4_;
            auVar101._24_4_ = auVar217._24_4_ ^ auVar48._8_4_;
            auVar101._28_4_ = auVar217._28_4_ ^ auVar48._12_4_;
          }
          else {
            p_Var14 = context->args->filter;
            if ((p_Var14 != (RTCFilterFunctionN)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar11->field_8).field_0x2 & 0x40) != 0)))) {
              _local_620 = auVar210._0_32_;
              auVar216 = ZEXT1632(auVar217._0_16_);
              (*p_Var14)(&local_650);
              auVar109 = ZEXT816(0) << 0x40;
              auVar216 = vcmpps_avx(auVar216,auVar216,0xf);
              auVar217 = ZEXT3264(auVar216);
              auVar210 = ZEXT3264(_local_620);
              auVar214 = ZEXT3264(_local_5c0);
              auVar183 = ZEXT3264(local_500);
              auVar179 = ZEXT3264(local_4e0);
              auVar170 = ZEXT3264(local_4c0);
              auVar157 = ZEXT3264(local_3a0);
              pSVar89 = local_688;
            }
            auVar47 = vpcmpeqd_avx(local_6c0,auVar109);
            auVar48 = vpcmpeqd_avx(local_6b0,auVar109);
            auVar106._16_16_ = auVar48;
            auVar106._0_16_ = auVar47;
            auVar101._0_4_ = auVar217._0_4_ ^ auVar47._0_4_;
            auVar101._4_4_ = auVar217._4_4_ ^ auVar47._4_4_;
            auVar101._8_4_ = auVar217._8_4_ ^ auVar47._8_4_;
            auVar101._12_4_ = auVar217._12_4_ ^ auVar47._12_4_;
            auVar101._16_4_ = auVar217._16_4_ ^ auVar48._0_4_;
            auVar101._20_4_ = auVar217._20_4_ ^ auVar48._4_4_;
            auVar101._24_4_ = auVar217._24_4_ ^ auVar48._8_4_;
            auVar101._28_4_ = auVar217._28_4_ ^ auVar48._12_4_;
            auVar117._8_4_ = 0xff800000;
            auVar117._0_8_ = 0xff800000ff800000;
            auVar117._12_4_ = 0xff800000;
            auVar117._16_4_ = 0xff800000;
            auVar117._20_4_ = 0xff800000;
            auVar117._24_4_ = 0xff800000;
            auVar117._28_4_ = 0xff800000;
            auVar216 = vblendvps_avx(auVar117,*(undefined1 (*) [32])(local_650.ray + 0x100),auVar106
                                    );
            *(undefined1 (*) [32])(local_650.ray + 0x100) = auVar216;
          }
          auVar168 = auVar170._0_32_;
          auVar216 = auVar157._0_32_;
          auVar182 = auVar183._0_32_;
          auVar178 = auVar179._0_32_;
          auVar213 = auVar214._0_32_;
          auVar209 = auVar210._0_32_;
          if ((((((((auVar101 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar101 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar101 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar101 >> 0x7f,0) != '\0') ||
                (auVar101 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar101 >> 0xbf,0) != '\0') ||
              (auVar101 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar101[0x1f] < '\0') {
            _local_5a0 = ZEXT416(*(uint *)(ray + k * 4 + 0x100));
            bVar93 = true;
            goto LAB_00a81cf5;
          }
          *(undefined4 *)(ray + k * 4 + 0x100) = local_5a0._0_4_;
        }
        auVar168 = auVar170._0_32_;
        auVar216 = auVar157._0_32_;
        auVar182 = auVar183._0_32_;
        auVar178 = auVar179._0_32_;
        auVar213 = auVar214._0_32_;
        auVar209 = auVar210._0_32_;
        uVar92 = uVar92 ^ 1L << (uVar15 & 0x3f);
      } while (uVar92 != 0);
      bVar93 = false;
LAB_00a81cf5:
      auVar2._4_4_ = fStack_67c;
      auVar2._0_4_ = local_680;
      auVar2._8_4_ = fStack_678;
      auVar2._12_4_ = fStack_674;
      auVar2._16_4_ = fStack_670;
      auVar2._20_4_ = fStack_66c;
      auVar2._24_4_ = fStack_668;
LAB_00a81d2b:
      auVar53 = vandps_avx(local_560,local_380);
      auVar47 = vpermilps_avx(_local_5a0,0);
      auVar107._16_16_ = auVar47;
      auVar107._0_16_ = auVar47;
      auVar54 = vcmpps_avx(local_4a0,auVar107,2);
      auVar55 = auVar53 & auVar54;
      if ((((((((auVar55 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar55 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar55 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar55 >> 0x7f,0) == '\0') &&
            (auVar55 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar55 >> 0xbf,0) == '\0') &&
          (auVar55 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar55[0x1f])
      {
        return bVar93;
      }
      auVar50 = vcmpps_avx(local_540,_local_5e0,0);
      auVar55 = vblendvps_avx(local_580,local_c0,auVar50);
      auVar49 = vblendvps_avx(auVar216,local_120,auVar50);
      auVar209 = vblendvps_avx(auVar168,auVar209,auVar50);
      auVar50 = vcmpps_avx(local_540,local_480,0);
      auVar51 = vcmpps_avx(local_540,_local_600,0);
      auVar50 = vorps_avx(auVar50,auVar51);
      fVar190 = local_540._0_4_;
      fVar194 = local_540._4_4_;
      fVar195 = local_540._8_4_;
      fVar103 = local_540._12_4_;
      fVar121 = local_540._16_4_;
      fVar124 = local_540._20_4_;
      fVar125 = local_540._24_4_;
      auVar152._0_4_ = (float)local_280._0_4_ * (auVar213._0_4_ + fVar190 * local_460) + local_420;
      auVar152._4_4_ = (float)local_280._4_4_ * (auVar213._4_4_ + fVar194 * fStack_45c) + fStack_41c
      ;
      auVar152._8_4_ = fStack_278 * (auVar213._8_4_ + fVar195 * fStack_458) + fStack_418;
      auVar152._12_4_ = fStack_274 * (auVar213._12_4_ + fVar103 * fStack_454) + fStack_414;
      auVar152._16_4_ = fStack_270 * (auVar213._16_4_ + fVar121 * fStack_450) + fStack_410;
      auVar152._20_4_ = fStack_26c * (auVar213._20_4_ + fVar124 * fStack_44c) + fStack_40c;
      auVar152._24_4_ = fStack_268 * (auVar213._24_4_ + fVar125 * fStack_448) + fStack_408;
      auVar152._28_4_ = auVar213._28_4_ + auVar51._28_4_ + fStack_404;
      auVar156._0_4_ = (float)local_280._0_4_ * (auVar178._0_4_ + auVar2._0_4_ * fVar190) + local_a0
      ;
      auVar156._4_4_ =
           (float)local_280._4_4_ * (auVar178._4_4_ + auVar2._4_4_ * fVar194) + fStack_9c;
      auVar156._8_4_ = fStack_278 * (auVar178._8_4_ + auVar2._8_4_ * fVar195) + fStack_98;
      auVar156._12_4_ = fStack_274 * (auVar178._12_4_ + auVar2._12_4_ * fVar103) + fStack_94;
      auVar156._16_4_ = fStack_270 * (auVar178._16_4_ + auVar2._16_4_ * fVar121) + fStack_90;
      auVar156._20_4_ = fStack_26c * (auVar178._20_4_ + auVar2._20_4_ * fVar124) + fStack_8c;
      auVar156._24_4_ = fStack_268 * (auVar178._24_4_ + auVar2._24_4_ * fVar125) + fStack_88;
      auVar156._28_4_ = auVar178._28_4_ + auVar216._28_4_ + fStack_84;
      auVar169._0_4_ = (float)local_280._0_4_ * (auVar182._0_4_ + fVar190 * local_260) + local_e0;
      auVar169._4_4_ = (float)local_280._4_4_ * (auVar182._4_4_ + fVar194 * fStack_25c) + fStack_dc;
      auVar169._8_4_ = fStack_278 * (auVar182._8_4_ + fVar195 * fStack_258) + fStack_d8;
      auVar169._12_4_ = fStack_274 * (auVar182._12_4_ + fVar103 * fStack_254) + fStack_d4;
      auVar169._16_4_ = fStack_270 * (auVar182._16_4_ + fVar121 * fStack_250) + fStack_d0;
      auVar169._20_4_ = fStack_26c * (auVar182._20_4_ + fVar124 * fStack_24c) + fStack_cc;
      auVar169._24_4_ = fStack_268 * (auVar182._24_4_ + fVar125 * fStack_248) + fStack_c8;
      auVar169._28_4_ = auVar182._28_4_ + auVar168._28_4_ + fStack_c4;
      auVar82._4_4_ = (float)local_3e0._4_4_ * fStack_43c;
      auVar82._0_4_ = (float)local_3e0._0_4_ * local_440;
      auVar82._8_4_ = fStack_3d8 * fStack_438;
      auVar82._12_4_ = fStack_3d4 * fStack_434;
      auVar82._16_4_ = fStack_3d0 * fStack_430;
      auVar82._20_4_ = fStack_3cc * fStack_42c;
      auVar82._24_4_ = fStack_3c8 * fStack_428;
      auVar82._28_4_ = uStack_264;
      auVar216 = vsubps_avx(auVar152,auVar82);
      auVar83._4_4_ = (float)local_3e0._4_4_ * fStack_7c;
      auVar83._0_4_ = (float)local_3e0._0_4_ * local_80;
      auVar83._8_4_ = fStack_3d8 * fStack_78;
      auVar83._12_4_ = fStack_3d4 * fStack_74;
      auVar83._16_4_ = fStack_3d0 * fStack_70;
      auVar83._20_4_ = fStack_3cc * fStack_6c;
      auVar83._24_4_ = fStack_3c8 * fStack_68;
      auVar83._28_4_ = uStack_264;
      auVar168 = vsubps_avx(auVar156,auVar83);
      auVar84._4_4_ = (float)local_3e0._4_4_ * fStack_3fc;
      auVar84._0_4_ = (float)local_3e0._0_4_ * local_400;
      auVar84._8_4_ = fStack_3d8 * fStack_3f8;
      auVar84._12_4_ = fStack_3d4 * fStack_3f4;
      auVar84._16_4_ = fStack_3d0 * fStack_3f0;
      auVar84._20_4_ = fStack_3cc * fStack_3ec;
      auVar84._24_4_ = fStack_3c8 * fStack_3e8;
      auVar84._28_4_ = uStack_264;
      auVar178 = vsubps_avx(auVar169,auVar84);
      local_2e0 = vblendvps_avx(auVar55,auVar216,auVar50);
      local_2c0 = vblendvps_avx(auVar49,auVar168,auVar50);
      local_2a0 = vblendvps_avx(auVar209,auVar178,auVar50);
      auVar85._4_4_ = (float)local_3e0._4_4_ * fStack_fc;
      auVar85._0_4_ = (float)local_3e0._0_4_ * local_100;
      auVar85._8_4_ = fStack_3d8 * fStack_f8;
      auVar85._12_4_ = fStack_3d4 * fStack_f4;
      auVar85._16_4_ = fStack_3d0 * fStack_f0;
      auVar85._20_4_ = fStack_3cc * fStack_ec;
      auVar85._24_4_ = fStack_3c8 * fStack_e8;
      auVar85._28_4_ = auVar216._28_4_;
      local_340 = vblendvps_avx(_local_520,auVar85,auVar50);
      auVar216 = vandps_avx(auVar54,auVar53);
      local_320 = ZEXT832(0) << 0x20;
      _local_300 = local_4a0;
      pSVar89 = context->scene;
      uVar90 = vmovmskps_avx(auVar216);
      uVar92 = CONCAT44((int)(uVar15 >> 0x20),uVar90);
      auVar216 = vcmpps_avx(_local_520,_local_520,0xf);
      auVar157 = ZEXT3264(auVar216);
      auVar170 = ZEXT864(0) << 0x20;
      do {
        local_650.valid = (int *)local_6c0;
        uVar15 = 0;
        if (uVar92 != 0) {
          for (; (uVar92 >> uVar15 & 1) == 0; uVar15 = uVar15 + 1) {
          }
        }
        uVar3 = *(uint *)(local_360 + uVar15 * 4);
        pGVar11 = (pSVar89->geometries).items[uVar3].ptr;
        if ((pGVar11->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
             (bVar86 = 1, pGVar11->occlusionFilterN == (RTCFilterFunctionN)0x0)) goto LAB_00a82160;
          local_1e0 = *(undefined4 *)(local_340 + uVar15 * 4);
          local_1c0 = *(undefined4 *)(local_320 + uVar15 * 4);
          *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_300 + uVar15 * 4);
          local_650.context = context->user;
          local_1a0 = (local_660->primIDs).field_0.i[uVar15];
          uVar90 = *(undefined4 *)(local_2e0 + uVar15 * 4);
          local_240._4_4_ = uVar90;
          local_240._0_4_ = uVar90;
          local_240._8_4_ = uVar90;
          local_240._12_4_ = uVar90;
          local_240._16_4_ = uVar90;
          local_240._20_4_ = uVar90;
          local_240._24_4_ = uVar90;
          local_240._28_4_ = uVar90;
          uVar90 = *(undefined4 *)(local_2c0 + uVar15 * 4);
          local_220._4_4_ = uVar90;
          local_220._0_4_ = uVar90;
          local_220._8_4_ = uVar90;
          local_220._12_4_ = uVar90;
          local_220._16_4_ = uVar90;
          local_220._20_4_ = uVar90;
          local_220._24_4_ = uVar90;
          local_220._28_4_ = uVar90;
          local_170 = vpshufd_avx(ZEXT416(uVar3),0);
          uVar90 = *(undefined4 *)(local_2a0 + uVar15 * 4);
          local_200._4_4_ = uVar90;
          local_200._0_4_ = uVar90;
          local_200._8_4_ = uVar90;
          local_200._12_4_ = uVar90;
          local_200._16_4_ = uVar90;
          local_200._20_4_ = uVar90;
          local_200._24_4_ = uVar90;
          local_200._28_4_ = uVar90;
          uStack_1dc = local_1e0;
          uStack_1d8 = local_1e0;
          uStack_1d4 = local_1e0;
          uStack_1d0 = local_1e0;
          uStack_1cc = local_1e0;
          uStack_1c8 = local_1e0;
          uStack_1c4 = local_1e0;
          uStack_1bc = local_1c0;
          uStack_1b8 = local_1c0;
          uStack_1b4 = local_1c0;
          uStack_1b0 = local_1c0;
          uStack_1ac = local_1c0;
          uStack_1a8 = local_1c0;
          uStack_1a4 = local_1c0;
          uStack_19c = local_1a0;
          uStack_198 = local_1a0;
          uStack_194 = local_1a0;
          uStack_190 = local_1a0;
          uStack_18c = local_1a0;
          uStack_188 = local_1a0;
          uStack_184 = local_1a0;
          local_180 = local_170;
          uStack_15c = (local_650.context)->instID[0];
          local_160 = uStack_15c;
          uStack_158 = uStack_15c;
          uStack_154 = uStack_15c;
          uStack_150 = uStack_15c;
          uStack_14c = uStack_15c;
          uStack_148 = uStack_15c;
          uStack_144 = uStack_15c;
          uStack_13c = (local_650.context)->instPrimID[0];
          local_140 = uStack_13c;
          uStack_138 = uStack_13c;
          uStack_134 = uStack_13c;
          uStack_130 = uStack_13c;
          uStack_12c = uStack_13c;
          uStack_128 = uStack_13c;
          uStack_124 = uStack_13c;
          local_6c0 = *(undefined1 (*) [16])(mm_lookupmask_ps + ((uVar88 & 0xf) << 4));
          local_6b0 = *(undefined1 (*) [16])(mm_lookupmask_ps + (long)((int)uVar88 >> 4) * 0x10);
          local_650.geometryUserPtr = pGVar11->userPtr;
          local_650.hit = (RTCHitN *)local_240;
          local_650.N = 8;
          local_650.ray = (RTCRayN *)ray;
          if (pGVar11->occlusionFilterN != (RTCFilterFunctionN)0x0) {
            local_680 = SUB84(pSVar89,0);
            fStack_67c = (float)((ulong)pSVar89 >> 0x20);
            auVar216 = ZEXT1632(auVar157._0_16_);
            (*pGVar11->occlusionFilterN)(&local_650);
            auVar170 = ZEXT1664(ZEXT816(0) << 0x40);
            auVar216 = vcmpps_avx(auVar216,auVar216,0xf);
            auVar157 = ZEXT3264(auVar216);
            pSVar89 = (Scene *)CONCAT44(fStack_67c,local_680);
            k = local_658;
          }
          auVar47 = vpcmpeqd_avx(auVar170._0_16_,local_6c0);
          auVar48 = vpcmpeqd_avx(auVar170._0_16_,local_6b0);
          auVar118._16_16_ = auVar48;
          auVar118._0_16_ = auVar47;
          auVar216 = auVar157._0_32_ & ~auVar118;
          if ((((((((auVar216 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar216 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar216 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar216 >> 0x7f,0) == '\0') &&
                (auVar216 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar216 >> 0xbf,0) == '\0') &&
              (auVar216 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar216[0x1f]) {
            auVar102._0_4_ = auVar47._0_4_ ^ auVar157._0_4_;
            auVar102._4_4_ = auVar47._4_4_ ^ auVar157._4_4_;
            auVar102._8_4_ = auVar47._8_4_ ^ auVar157._8_4_;
            auVar102._12_4_ = auVar47._12_4_ ^ auVar157._12_4_;
            auVar102._16_4_ = auVar48._0_4_ ^ auVar157._16_4_;
            auVar102._20_4_ = auVar48._4_4_ ^ auVar157._20_4_;
            auVar102._24_4_ = auVar48._8_4_ ^ auVar157._24_4_;
            auVar102._28_4_ = auVar48._12_4_ ^ auVar157._28_4_;
          }
          else {
            p_Var14 = context->args->filter;
            if ((p_Var14 != (RTCFilterFunctionN)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar11->field_8).field_0x2 & 0x40) != 0)))) {
              local_680 = SUB84(pSVar89,0);
              fStack_67c = (float)((ulong)pSVar89 >> 0x20);
              auVar216 = ZEXT1632(auVar157._0_16_);
              (*p_Var14)(&local_650);
              auVar170 = ZEXT1664(ZEXT816(0) << 0x40);
              auVar216 = vcmpps_avx(auVar216,auVar216,0xf);
              auVar157 = ZEXT3264(auVar216);
              pSVar89 = (Scene *)CONCAT44(fStack_67c,local_680);
            }
            auVar47 = vpcmpeqd_avx(auVar170._0_16_,local_6c0);
            auVar48 = vpcmpeqd_avx(auVar170._0_16_,local_6b0);
            auVar108._16_16_ = auVar48;
            auVar108._0_16_ = auVar47;
            auVar102._0_4_ = auVar47._0_4_ ^ auVar157._0_4_;
            auVar102._4_4_ = auVar47._4_4_ ^ auVar157._4_4_;
            auVar102._8_4_ = auVar47._8_4_ ^ auVar157._8_4_;
            auVar102._12_4_ = auVar47._12_4_ ^ auVar157._12_4_;
            auVar102._16_4_ = auVar48._0_4_ ^ auVar157._16_4_;
            auVar102._20_4_ = auVar48._4_4_ ^ auVar157._20_4_;
            auVar102._24_4_ = auVar48._8_4_ ^ auVar157._24_4_;
            auVar102._28_4_ = auVar48._12_4_ ^ auVar157._28_4_;
            auVar119._8_4_ = 0xff800000;
            auVar119._0_8_ = 0xff800000ff800000;
            auVar119._12_4_ = 0xff800000;
            auVar119._16_4_ = 0xff800000;
            auVar119._20_4_ = 0xff800000;
            auVar119._24_4_ = 0xff800000;
            auVar119._28_4_ = 0xff800000;
            auVar216 = vblendvps_avx(auVar119,*(undefined1 (*) [32])(local_650.ray + 0x100),auVar108
                                    );
            *(undefined1 (*) [32])(local_650.ray + 0x100) = auVar216;
          }
          if ((((((((auVar102 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar102 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar102 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar102 >> 0x7f,0) != '\0') ||
                (auVar102 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar102 >> 0xbf,0) != '\0') ||
              (auVar102 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar102[0x1f] < '\0') {
            bVar86 = 1;
            goto LAB_00a82160;
          }
          *(int *)(ray + k * 4 + 0x100) = local_5a0._0_4_;
        }
        uVar92 = uVar92 ^ 1L << (uVar15 & 0x3f);
        if (uVar92 == 0) {
          bVar86 = 0;
LAB_00a82160:
          return (bool)(bVar93 | bVar86);
        }
      } while( true );
    }
  }
  return false;
}

Assistant:

static __forceinline bool occluded(const Precalculations& pre, RayK<K>& ray, size_t k, RayQueryContext* context, const Primitive& line)
      {
        STAT3(shadow.trav_prims,1,1,1);
        const LineSegments* geom = context->scene->get<LineSegments>(line.geomID());
        Vec4vf<M> v0,v1; 
        vbool<M> cL,cR;
        line.gather(v0,v1,cL,cR,geom,ray.time()[k]);
        const vbool<M> valid = line.valid();
        return ConeCurveIntersectorK<M,K>::intersect(valid,ray,k,context,geom,pre,v0,v1,cL,cR,Occluded1KEpilogM<M,K,filter>(ray,k,context,line.geomID(),line.primID()));
      }